

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  uint uVar57;
  uint uVar58;
  long lVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  undefined4 uVar63;
  undefined8 unaff_R13;
  ulong uVar64;
  bool bVar65;
  float fVar66;
  undefined8 uVar67;
  float fVar92;
  vint4 bi_2;
  undefined1 auVar68 [16];
  float fVar91;
  float fVar93;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar71 [16];
  undefined1 auVar86 [32];
  undefined1 auVar77 [16];
  undefined1 auVar88 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 extraout_var_00 [60];
  float fVar94;
  undefined8 extraout_XMM1_Qa;
  float fVar124;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar110 [32];
  float fVar123;
  float fVar125;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar144;
  float fVar169;
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  vint4 ai;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [28];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar207;
  float fVar208;
  vint4 ai_1;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar246;
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar245 [64];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar253 [16];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c44;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8e8;
  ulong local_8e0;
  undefined1 auStack_8d8 [24];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 auVar122 [64];
  undefined1 auVar238 [16];
  undefined1 auVar254 [32];
  
  PVar1 = prim[1];
  uVar64 = (ulong)(byte)PVar1;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar66 = *(float *)(prim + uVar64 * 0x19 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar64 * 0x19 + 6));
  auVar68._0_4_ = fVar66 * auVar5._0_4_;
  auVar68._4_4_ = fVar66 * auVar5._4_4_;
  auVar68._8_4_ = fVar66 * auVar5._8_4_;
  auVar68._12_4_ = fVar66 * auVar5._12_4_;
  auVar183._0_4_ = fVar66 * auVar6._0_4_;
  auVar183._4_4_ = fVar66 * auVar6._4_4_;
  auVar183._8_4_ = fVar66 * auVar6._8_4_;
  auVar183._12_4_ = fVar66 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xc + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x12 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x13 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x14 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar260._4_4_ = auVar183._0_4_;
  auVar260._0_4_ = auVar183._0_4_;
  auVar260._8_4_ = auVar183._0_4_;
  auVar260._12_4_ = auVar183._0_4_;
  auVar96 = vshufps_avx(auVar183,auVar183,0x55);
  auVar73 = vshufps_avx(auVar183,auVar183,0xaa);
  fVar66 = auVar73._0_4_;
  auVar233._0_4_ = fVar66 * auVar7._0_4_;
  fVar91 = auVar73._4_4_;
  auVar233._4_4_ = fVar91 * auVar7._4_4_;
  fVar92 = auVar73._8_4_;
  auVar233._8_4_ = fVar92 * auVar7._8_4_;
  fVar93 = auVar73._12_4_;
  auVar233._12_4_ = fVar93 * auVar7._12_4_;
  auVar228._0_4_ = auVar9._0_4_ * fVar66;
  auVar228._4_4_ = auVar9._4_4_ * fVar91;
  auVar228._8_4_ = auVar9._8_4_ * fVar92;
  auVar228._12_4_ = auVar9._12_4_ * fVar93;
  auVar213._0_4_ = auVar79._0_4_ * fVar66;
  auVar213._4_4_ = auVar79._4_4_ * fVar91;
  auVar213._8_4_ = auVar79._8_4_ * fVar92;
  auVar213._12_4_ = auVar79._12_4_ * fVar93;
  auVar73 = vfmadd231ps_fma(auVar233,auVar96,auVar6);
  auVar97 = vfmadd231ps_fma(auVar228,auVar96,auVar76);
  auVar96 = vfmadd231ps_fma(auVar213,auVar69,auVar96);
  auVar145 = vfmadd231ps_fma(auVar73,auVar260,auVar5);
  auVar97 = vfmadd231ps_fma(auVar97,auVar260,auVar8);
  auVar171 = vfmadd231ps_fma(auVar96,auVar70,auVar260);
  auVar261._4_4_ = auVar68._0_4_;
  auVar261._0_4_ = auVar68._0_4_;
  auVar261._8_4_ = auVar68._0_4_;
  auVar261._12_4_ = auVar68._0_4_;
  auVar96 = vshufps_avx(auVar68,auVar68,0x55);
  auVar73 = vshufps_avx(auVar68,auVar68,0xaa);
  fVar66 = auVar73._0_4_;
  auVar184._0_4_ = fVar66 * auVar7._0_4_;
  fVar91 = auVar73._4_4_;
  auVar184._4_4_ = fVar91 * auVar7._4_4_;
  fVar92 = auVar73._8_4_;
  auVar184._8_4_ = fVar92 * auVar7._8_4_;
  fVar93 = auVar73._12_4_;
  auVar184._12_4_ = fVar93 * auVar7._12_4_;
  auVar95._0_4_ = auVar9._0_4_ * fVar66;
  auVar95._4_4_ = auVar9._4_4_ * fVar91;
  auVar95._8_4_ = auVar9._8_4_ * fVar92;
  auVar95._12_4_ = auVar9._12_4_ * fVar93;
  auVar73._0_4_ = auVar79._0_4_ * fVar66;
  auVar73._4_4_ = auVar79._4_4_ * fVar91;
  auVar73._8_4_ = auVar79._8_4_ * fVar92;
  auVar73._12_4_ = auVar79._12_4_ * fVar93;
  auVar6 = vfmadd231ps_fma(auVar184,auVar96,auVar6);
  auVar7 = vfmadd231ps_fma(auVar95,auVar96,auVar76);
  auVar76 = vfmadd231ps_fma(auVar73,auVar96,auVar69);
  auVar9 = vfmadd231ps_fma(auVar6,auVar261,auVar5);
  auVar69 = vfmadd231ps_fma(auVar7,auVar261,auVar8);
  auVar79 = vfmadd231ps_fma(auVar76,auVar261,auVar70);
  auVar224._8_4_ = 0x7fffffff;
  auVar224._0_8_ = 0x7fffffff7fffffff;
  auVar224._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar145,auVar224);
  auVar170._8_4_ = 0x219392ef;
  auVar170._0_8_ = 0x219392ef219392ef;
  auVar170._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar170,1);
  auVar6 = vblendvps_avx(auVar145,auVar170,auVar5);
  auVar5 = vandps_avx(auVar97,auVar224);
  auVar5 = vcmpps_avx(auVar5,auVar170,1);
  auVar7 = vblendvps_avx(auVar97,auVar170,auVar5);
  auVar5 = vandps_avx(auVar224,auVar171);
  auVar5 = vcmpps_avx(auVar5,auVar170,1);
  auVar5 = vblendvps_avx(auVar171,auVar170,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = 0x3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar214);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar214);
  auVar76 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar214);
  auVar70 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar171._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar171._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar171._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar171._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar185._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar185._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar185._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar185._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar64 * 0xe + 6);
  auVar5 = vpmovsxwd_avx(auVar7);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar69);
  auVar198._0_4_ = auVar76._0_4_ * auVar5._0_4_;
  auVar198._4_4_ = auVar76._4_4_ * auVar5._4_4_;
  auVar198._8_4_ = auVar76._8_4_ * auVar5._8_4_;
  auVar198._12_4_ = auVar76._12_4_ * auVar5._12_4_;
  auVar97._1_3_ = 0;
  auVar97[0] = PVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar69);
  auVar96._0_4_ = auVar76._0_4_ * auVar5._0_4_;
  auVar96._4_4_ = auVar76._4_4_ * auVar5._4_4_;
  auVar96._8_4_ = auVar76._8_4_ * auVar5._8_4_;
  auVar96._12_4_ = auVar76._12_4_ * auVar5._12_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar64 * 0x15 + 6);
  auVar5 = vpmovsxwd_avx(auVar76);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar79);
  auVar145._0_4_ = auVar70._0_4_ * auVar5._0_4_;
  auVar145._4_4_ = auVar70._4_4_ * auVar5._4_4_;
  auVar145._8_4_ = auVar70._8_4_ * auVar5._8_4_;
  auVar145._12_4_ = auVar70._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar64 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar79);
  auVar69._0_4_ = auVar70._0_4_ * auVar5._0_4_;
  auVar69._4_4_ = auVar70._4_4_ * auVar5._4_4_;
  auVar69._8_4_ = auVar70._8_4_ * auVar5._8_4_;
  auVar69._12_4_ = auVar70._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar171,auVar185);
  auVar6 = vpminsd_avx(auVar198,auVar96);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar145,auVar69);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar229._4_4_ = uVar63;
  auVar229._0_4_ = uVar63;
  auVar229._8_4_ = uVar63;
  auVar229._12_4_ = uVar63;
  auVar6 = vmaxps_avx(auVar6,auVar229);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_5a0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar171,auVar185);
  auVar6 = vpmaxsd_avx(auVar198,auVar96);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar145,auVar69);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar79._4_4_ = uVar63;
  auVar79._0_4_ = uVar63;
  auVar79._8_4_ = uVar63;
  auVar79._12_4_ = uVar63;
  auVar6 = vminps_avx(auVar6,auVar79);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar70._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar97[4] = PVar1;
  auVar97._5_3_ = 0;
  auVar97[8] = PVar1;
  auVar97._9_3_ = 0;
  auVar97[0xc] = PVar1;
  auVar97._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar97,_DAT_01f4ad30);
  auVar5 = vcmpps_avx(local_5a0,auVar70,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar63 = vmovmskps_avx(auVar5);
  uVar64 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar63);
  auVar84._16_16_ = mm_lookupmask_ps._240_16_;
  auVar84._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_8e8 = prim;
LAB_0119248e:
  if (uVar64 == 0) {
    return;
  }
  lVar59 = 0;
  for (uVar61 = uVar64; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar58 = *(uint *)(local_8e8 + 2);
  local_760 = *(uint *)(local_8e8 + lVar59 * 4 + 6);
  local_8e0 = (ulong)local_760;
  pGVar3 = (context->scene->geometries).items[uVar58].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8e0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar59 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar59 + (long)p_Var4 * uVar61);
  auVar6 = *(undefined1 (*) [16])(lVar59 + (uVar61 + 1) * (long)p_Var4);
  auVar7 = *(undefined1 (*) [16])(lVar59 + (uVar61 + 2) * (long)p_Var4);
  uVar64 = uVar64 - 1 & uVar64;
  auVar8 = *(undefined1 (*) [16])(lVar59 + (uVar61 + 3) * (long)p_Var4);
  if (uVar64 != 0) {
    uVar62 = uVar64 - 1 & uVar64;
    for (uVar61 = uVar64; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar62 != 0) {
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar9 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar243._4_4_ = uVar63;
  auVar243._0_4_ = uVar63;
  auVar243._8_4_ = uVar63;
  auVar243._12_4_ = uVar63;
  fStack_650 = (float)uVar63;
  _local_660 = auVar243;
  fStack_64c = (float)uVar63;
  fStack_648 = (float)uVar63;
  register0x0000151c = uVar63;
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar238._4_4_ = uVar63;
  auVar238._0_4_ = uVar63;
  auVar238._8_4_ = uVar63;
  auVar238._12_4_ = uVar63;
  fStack_630 = (float)uVar63;
  _local_640 = auVar238;
  fStack_62c = (float)uVar63;
  fStack_628 = (float)uVar63;
  register0x000014dc = uVar63;
  auVar242 = ZEXT3264(_local_640);
  auVar76 = vunpcklps_avx(auVar243,auVar238);
  fVar66 = *(float *)(ray + k * 4 + 0x60);
  auVar234._4_4_ = fVar66;
  auVar234._0_4_ = fVar66;
  auVar234._8_4_ = fVar66;
  auVar234._12_4_ = fVar66;
  fStack_890 = fVar66;
  _local_8a0 = auVar234;
  fStack_88c = fVar66;
  fStack_888 = fVar66;
  register0x0000149c = fVar66;
  local_970 = vinsertps_avx(auVar76,auVar234,0x28);
  auVar186._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_) * 0.25;
  auVar186._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_ + auVar8._4_4_) * 0.25;
  auVar186._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_ + auVar8._8_4_) * 0.25;
  auVar186._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_ + auVar8._12_4_) * 0.25;
  auVar76 = vsubps_avx(auVar186,auVar9);
  auVar76 = vdpps_avx(auVar76,local_970,0x7f);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  auVar232 = ZEXT1664(local_980);
  auVar70 = vrcpss_avx(local_980,local_980);
  auVar69 = vfnmadd213ss_fma(auVar70,local_980,ZEXT416(0x40000000));
  local_3e0 = auVar76._0_4_ * auVar70._0_4_ * auVar69._0_4_;
  auVar199._4_4_ = local_3e0;
  auVar199._0_4_ = local_3e0;
  auVar199._8_4_ = local_3e0;
  auVar199._12_4_ = local_3e0;
  fStack_8b0 = local_3e0;
  _local_8c0 = auVar199;
  fStack_8ac = local_3e0;
  fStack_8a8 = local_3e0;
  fStack_8a4 = local_3e0;
  auVar76 = vfmadd231ps_fma(auVar9,local_970,auVar199);
  auVar76 = vblendps_avx(auVar76,_DAT_01f45a50,8);
  auVar9 = vsubps_avx(auVar5,auVar76);
  auVar70 = vsubps_avx(auVar7,auVar76);
  auVar69 = vsubps_avx(auVar6,auVar76);
  auVar8 = vsubps_avx(auVar8,auVar76);
  auVar5 = vmovshdup_avx(auVar9);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar67 = auVar5._0_8_;
  auVar217._8_8_ = uVar67;
  auVar217._0_8_ = uVar67;
  auVar217._16_8_ = uVar67;
  auVar217._24_8_ = uVar67;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  uVar67 = auVar5._0_8_;
  auVar203._8_8_ = uVar67;
  auVar203._0_8_ = uVar67;
  auVar203._16_8_ = uVar67;
  auVar203._24_8_ = uVar67;
  auVar5 = vmovshdup_avx(auVar69);
  uVar67 = auVar5._0_8_;
  auVar178._8_8_ = uVar67;
  auVar178._0_8_ = uVar67;
  auVar178._16_8_ = uVar67;
  auVar178._24_8_ = uVar67;
  auVar5 = vshufps_avx(auVar69,auVar69,0xaa);
  local_960 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar69,auVar69,0xff);
  uVar67 = auVar5._0_8_;
  auVar254._8_8_ = uVar67;
  auVar254._0_8_ = uVar67;
  auVar254._16_8_ = uVar67;
  auVar254._24_8_ = uVar67;
  auVar258 = ZEXT3264(auVar254);
  auVar5 = vmovshdup_avx(auVar70);
  uVar67 = auVar5._0_8_;
  local_500._8_8_ = uVar67;
  local_500._0_8_ = uVar67;
  local_500._16_8_ = uVar67;
  local_500._24_8_ = uVar67;
  auVar6 = vshufps_avx(auVar70,auVar70,0xaa);
  uVar67 = auVar6._0_8_;
  auVar266._8_8_ = uVar67;
  auVar266._0_8_ = uVar67;
  auVar266._16_8_ = uVar67;
  auVar266._24_8_ = uVar67;
  auVar5 = vshufps_avx(auVar70,auVar70,0xff);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vmovshdup_avx(auVar8);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_260 = auVar5._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar66 * fVar66)),_local_640,_local_640);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_660,_local_660);
  uVar63 = auVar5._0_4_;
  local_280._4_4_ = uVar63;
  local_280._0_4_ = uVar63;
  local_280._8_4_ = uVar63;
  local_280._12_4_ = uVar63;
  local_280._16_4_ = uVar63;
  local_280._20_4_ = uVar63;
  local_280._24_4_ = uVar63;
  local_280._28_4_ = uVar63;
  auVar237 = ZEXT3264(local_280);
  fVar66 = *(float *)(ray + k * 4 + 0x30);
  local_910 = ZEXT416((uint)local_3e0);
  local_3e0 = fVar66 - local_3e0;
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  uVar61 = 0;
  local_c44 = 1;
  uVar63 = auVar9._0_4_;
  local_3a0._4_4_ = uVar63;
  local_3a0._0_4_ = uVar63;
  local_3a0._8_4_ = uVar63;
  local_3a0._12_4_ = uVar63;
  local_3a0._16_4_ = uVar63;
  local_3a0._20_4_ = uVar63;
  local_3a0._24_4_ = uVar63;
  local_3a0._28_4_ = uVar63;
  fVar91 = auVar69._0_4_;
  local_3c0._4_4_ = fVar91;
  local_3c0._0_4_ = fVar91;
  local_3c0._8_4_ = fVar91;
  local_3c0._12_4_ = fVar91;
  local_3c0._16_4_ = fVar91;
  local_3c0._20_4_ = fVar91;
  local_3c0._24_4_ = fVar91;
  local_3c0._28_4_ = fVar91;
  fVar92 = auVar70._0_4_;
  local_2a0 = fVar92;
  fStack_29c = fVar92;
  fStack_298 = fVar92;
  fStack_294 = fVar92;
  fStack_290 = fVar92;
  fStack_28c = fVar92;
  fStack_288 = fVar92;
  fStack_284 = fVar92;
  fVar93 = auVar8._0_4_;
  local_2c0 = fVar93;
  fStack_2bc = fVar93;
  fStack_2b8 = fVar93;
  fStack_2b4 = fVar93;
  fStack_2b0 = fVar93;
  fStack_2ac = fVar93;
  fStack_2a8 = fVar93;
  fStack_2a4 = fVar93;
  local_680._8_4_ = 0x7fffffff;
  local_680._0_8_ = 0x7fffffff7fffffff;
  local_680._12_4_ = 0x7fffffff;
  local_680._16_4_ = 0x7fffffff;
  local_680._20_4_ = 0x7fffffff;
  local_680._24_4_ = 0x7fffffff;
  local_680._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_280,local_680);
  auVar5 = vsqrtss_avx(local_980,local_980);
  auVar7 = vsqrtss_avx(local_980,local_980);
  auVar245 = ZEXT3264(CONCAT824(local_960,CONCAT816(local_960,CONCAT88(local_960,local_960))));
  local_590 = ZEXT816(0x3f80000000000000);
  local_540 = auVar217;
  local_560 = auVar178;
  local_9e0 = auVar203;
  uStack_958 = local_960;
  uStack_950 = local_960;
  uStack_948 = local_960;
  uStack_75c = local_760;
  uStack_758 = local_760;
  uStack_754 = local_760;
  local_750 = uVar58;
  uStack_74c = uVar58;
  uStack_748 = uVar58;
  uStack_744 = uVar58;
  do {
    auVar76 = vmovshdup_avx(local_590);
    auVar76 = vsubps_avx(auVar76,local_590);
    fVar141 = auVar76._0_4_;
    fVar128 = fVar141 * 0.04761905;
    local_7a0._0_4_ = local_590._0_4_;
    local_7a0._4_4_ = local_7a0._0_4_;
    local_7a0._8_4_ = local_7a0._0_4_;
    local_7a0._12_4_ = local_7a0._0_4_;
    local_7a0._16_4_ = local_7a0._0_4_;
    local_7a0._20_4_ = local_7a0._0_4_;
    local_7a0._24_4_ = local_7a0._0_4_;
    local_7a0._28_4_ = local_7a0._0_4_;
    local_7c0._4_4_ = fVar141;
    local_7c0._0_4_ = fVar141;
    local_7c0._8_4_ = fVar141;
    local_7c0._12_4_ = fVar141;
    local_7c0._16_4_ = fVar141;
    local_7c0._20_4_ = fVar141;
    local_7c0._24_4_ = fVar141;
    local_7c0._28_4_ = fVar141;
    auVar76 = vfmadd231ps_fma(local_7a0,local_7c0,_DAT_01f7b040);
    auVar110._8_4_ = 0x3f800000;
    auVar110._0_8_ = 0x3f8000003f800000;
    auVar110._12_4_ = 0x3f800000;
    auVar110._16_4_ = 0x3f800000;
    auVar110._20_4_ = 0x3f800000;
    auVar110._24_4_ = 0x3f800000;
    auVar110._28_4_ = 0x3f800000;
    auVar84 = vsubps_avx(auVar110,ZEXT1632(auVar76));
    fVar129 = auVar76._0_4_;
    auVar206._0_4_ = local_3c0._0_4_ * fVar129;
    fVar94 = auVar76._4_4_;
    auVar206._4_4_ = local_3c0._4_4_ * fVar94;
    fVar140 = auVar76._8_4_;
    auVar206._8_4_ = local_3c0._8_4_ * fVar140;
    fVar123 = auVar76._12_4_;
    auVar206._12_4_ = local_3c0._12_4_ * fVar123;
    auVar206._16_4_ = local_3c0._16_4_ * 0.0;
    auVar206._20_4_ = local_3c0._20_4_ * 0.0;
    auVar206._28_36_ = auVar242._28_36_;
    auVar206._24_4_ = local_3c0._24_4_ * 0.0;
    auVar242._0_4_ = auVar178._0_4_ * fVar129;
    auVar242._4_4_ = auVar178._4_4_ * fVar94;
    auVar242._8_4_ = auVar178._8_4_ * fVar140;
    auVar242._12_4_ = auVar178._12_4_ * fVar123;
    auVar242._16_4_ = auVar178._16_4_ * 0.0;
    auVar242._20_4_ = auVar178._20_4_ * 0.0;
    auVar242._28_36_ = auVar237._28_36_;
    auVar242._24_4_ = auVar178._24_4_ * 0.0;
    auVar237._0_4_ = auVar245._0_4_ * fVar129;
    auVar237._4_4_ = auVar245._4_4_ * fVar94;
    auVar237._8_4_ = auVar245._8_4_ * fVar140;
    auVar237._12_4_ = auVar245._12_4_ * fVar123;
    auVar237._16_4_ = auVar245._16_4_ * 0.0;
    auVar237._20_4_ = auVar245._20_4_ * 0.0;
    auVar237._28_36_ = auVar232._28_36_;
    auVar237._24_4_ = auVar245._24_4_ * 0.0;
    auVar164._4_4_ = auVar258._4_4_ * fVar94;
    auVar164._0_4_ = auVar258._0_4_ * fVar129;
    auVar164._8_4_ = auVar258._8_4_ * fVar140;
    auVar164._12_4_ = auVar258._12_4_ * fVar123;
    auVar164._16_4_ = auVar258._16_4_ * 0.0;
    auVar164._20_4_ = auVar258._20_4_ * 0.0;
    auVar164._24_4_ = auVar258._24_4_ * 0.0;
    auVar164._28_4_ = fVar141;
    auVar76 = vfmadd231ps_fma(auVar206._0_32_,auVar84,local_3a0);
    auVar53._8_8_ = uStack_1d8;
    auVar53._0_8_ = local_1e0;
    auVar53._16_8_ = uStack_1d0;
    auVar53._24_8_ = uStack_1c8;
    auVar79 = vfmadd231ps_fma(auVar242._0_32_,auVar84,auVar53);
    auVar96 = vfmadd231ps_fma(auVar237._0_32_,auVar84,auVar217);
    auVar73 = vfmadd231ps_fma(auVar164,auVar84,auVar203);
    auVar51._4_4_ = fStack_29c;
    auVar51._0_4_ = local_2a0;
    auVar51._8_4_ = fStack_298;
    auVar51._12_4_ = fStack_294;
    auVar51._16_4_ = fStack_290;
    auVar51._20_4_ = fStack_28c;
    auVar51._24_4_ = fStack_288;
    auVar51._28_4_ = fStack_284;
    auVar167._4_4_ = fStack_29c * fVar94;
    auVar167._0_4_ = local_2a0 * fVar129;
    auVar167._8_4_ = fStack_298 * fVar140;
    auVar167._12_4_ = fStack_294 * fVar123;
    auVar167._16_4_ = fStack_290 * 0.0;
    auVar167._20_4_ = fStack_28c * 0.0;
    auVar167._24_4_ = fStack_288 * 0.0;
    auVar167._28_4_ = auVar203._28_4_;
    auVar181._4_4_ = local_500._4_4_ * fVar94;
    auVar181._0_4_ = local_500._0_4_ * fVar129;
    auVar181._8_4_ = local_500._8_4_ * fVar140;
    auVar181._12_4_ = local_500._12_4_ * fVar123;
    auVar181._16_4_ = local_500._16_4_ * 0.0;
    auVar181._20_4_ = local_500._20_4_ * 0.0;
    auVar181._24_4_ = local_500._24_4_ * 0.0;
    auVar181._28_4_ = auVar217._28_4_;
    fVar141 = auVar6._0_4_;
    fVar142 = auVar6._4_4_;
    auVar11._4_4_ = fVar142 * fVar94;
    auVar11._0_4_ = fVar141 * fVar129;
    auVar11._8_4_ = fVar141 * fVar140;
    auVar11._12_4_ = fVar142 * fVar123;
    auVar11._16_4_ = fVar141 * 0.0;
    auVar11._20_4_ = fVar142 * 0.0;
    auVar11._24_4_ = fVar141 * 0.0;
    auVar11._28_4_ = local_3a0._28_4_;
    auVar52._8_8_ = uStack_1f8;
    auVar52._0_8_ = local_200;
    auVar52._16_8_ = uStack_1f0;
    auVar52._24_8_ = uStack_1e8;
    auVar55._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar94;
    auVar55._0_4_ = (float)local_200 * fVar129;
    auVar55._8_4_ = (float)uStack_1f8 * fVar140;
    auVar55._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar123;
    auVar55._16_4_ = (float)uStack_1f0 * 0.0;
    auVar55._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar55._24_4_ = (float)uStack_1e8 * 0.0;
    auVar55._28_4_ = DAT_01f7b040._28_4_;
    auVar97 = vfmadd231ps_fma(auVar167,auVar84,local_3c0);
    auVar145 = vfmadd231ps_fma(auVar181,auVar84,auVar178);
    auVar171 = vfmadd231ps_fma(auVar11,auVar84,auVar245._0_32_);
    auVar68 = vfmadd231ps_fma(auVar55,auVar84,auVar258._0_32_);
    auVar259._0_4_ = fVar129 * local_2c0;
    auVar259._4_4_ = fVar94 * fStack_2bc;
    auVar259._8_4_ = fVar140 * fStack_2b8;
    auVar259._12_4_ = fVar123 * fStack_2b4;
    auVar259._16_4_ = fStack_2b0 * 0.0;
    auVar259._20_4_ = fStack_2ac * 0.0;
    auVar259._28_36_ = auVar258._28_36_;
    auVar259._24_4_ = fStack_2a8 * 0.0;
    auVar232._0_4_ = fVar129 * (float)local_220;
    auVar232._4_4_ = fVar94 * local_220._4_4_;
    auVar232._8_4_ = fVar140 * (float)uStack_218;
    auVar232._12_4_ = fVar123 * uStack_218._4_4_;
    auVar232._16_4_ = (float)uStack_210 * 0.0;
    auVar232._20_4_ = uStack_210._4_4_ * 0.0;
    auVar232._28_36_ = auVar245._28_36_;
    auVar232._24_4_ = (float)uStack_208 * 0.0;
    auVar227._28_4_ = local_3c0._28_4_;
    auVar227._0_28_ =
         ZEXT1628(CONCAT412(auVar97._12_4_ * fVar123,
                            CONCAT48(auVar97._8_4_ * fVar140,
                                     CONCAT44(auVar97._4_4_ * fVar94,auVar97._0_4_ * fVar129))));
    auVar76 = vfmadd231ps_fma(auVar227,auVar84,ZEXT1632(auVar76));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar145._12_4_,
                                                 CONCAT48(fVar140 * auVar145._8_4_,
                                                          CONCAT44(fVar94 * auVar145._4_4_,
                                                                   fVar129 * auVar145._0_4_)))),
                              auVar84,ZEXT1632(auVar79));
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar171._12_4_,
                                                 CONCAT48(fVar140 * auVar171._8_4_,
                                                          CONCAT44(fVar94 * auVar171._4_4_,
                                                                   fVar129 * auVar171._0_4_)))),
                              auVar84,ZEXT1632(auVar96));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar68._12_4_,
                                                 CONCAT48(fVar140 * auVar68._8_4_,
                                                          CONCAT44(fVar94 * auVar68._4_4_,
                                                                   fVar129 * auVar68._0_4_)))),
                              auVar84,ZEXT1632(auVar73));
    auVar205._4_4_ = fVar94 * local_240._4_4_;
    auVar205._0_4_ = fVar129 * (float)local_240;
    auVar205._8_4_ = fVar140 * (float)uStack_238;
    auVar205._12_4_ = fVar123 * uStack_238._4_4_;
    auVar205._16_4_ = (float)uStack_230 * 0.0;
    auVar205._20_4_ = uStack_230._4_4_ * 0.0;
    auVar205._24_4_ = (float)uStack_228 * 0.0;
    auVar205._28_4_ = auVar178._28_4_;
    auVar95 = vfmadd231ps_fma(auVar259._0_32_,auVar84,auVar51);
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar95._12_4_ * fVar123,
                                                 CONCAT48(auVar95._8_4_ * fVar140,
                                                          CONCAT44(auVar95._4_4_ * fVar94,
                                                                   auVar95._0_4_ * fVar129)))),
                              auVar84,ZEXT1632(auVar97));
    auVar225._0_4_ = fVar129 * (float)local_260;
    auVar225._4_4_ = fVar94 * local_260._4_4_;
    auVar225._8_4_ = fVar140 * (float)uStack_258;
    auVar225._12_4_ = fVar123 * uStack_258._4_4_;
    auVar225._16_4_ = (float)uStack_250 * 0.0;
    auVar225._20_4_ = uStack_250._4_4_ * 0.0;
    auVar225._24_4_ = (float)uStack_248 * 0.0;
    auVar225._28_4_ = 0;
    auVar95 = vfmadd231ps_fma(auVar232._0_32_,auVar84,local_500);
    auVar170 = vfmadd231ps_fma(auVar205,auVar84,auVar266);
    auVar183 = vfmadd231ps_fma(auVar225,auVar84,auVar52);
    auVar160._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar160._0_28_ =
         ZEXT1628(CONCAT412(auVar183._12_4_ * fVar123,
                            CONCAT48(auVar183._8_4_ * fVar140,
                                     CONCAT44(auVar183._4_4_ * fVar94,auVar183._0_4_ * fVar129))));
    auVar145 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar95._12_4_ * fVar123,
                                                  CONCAT48(auVar95._8_4_ * fVar140,
                                                           CONCAT44(auVar95._4_4_ * fVar94,
                                                                    auVar95._0_4_ * fVar129)))),
                               auVar84,ZEXT1632(auVar145));
    auVar171 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar170._12_4_,
                                                  CONCAT48(fVar140 * auVar170._8_4_,
                                                           CONCAT44(fVar94 * auVar170._4_4_,
                                                                    fVar129 * auVar170._0_4_)))),
                               auVar84,ZEXT1632(auVar171));
    auVar68 = vfmadd231ps_fma(auVar160,auVar84,ZEXT1632(auVar68));
    auVar56._28_4_ = fVar142;
    auVar56._0_28_ =
         ZEXT1628(CONCAT412(fVar123 * auVar171._12_4_,
                            CONCAT48(fVar140 * auVar171._8_4_,
                                     CONCAT44(fVar94 * auVar171._4_4_,fVar129 * auVar171._0_4_))));
    auVar239._28_4_ = fStack_284;
    auVar239._0_28_ =
         ZEXT1628(CONCAT412(auVar68._12_4_ * fVar123,
                            CONCAT48(auVar68._8_4_ * fVar140,
                                     CONCAT44(auVar68._4_4_ * fVar94,auVar68._0_4_ * fVar129))));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar97._12_4_ * fVar123,
                                                 CONCAT48(auVar97._8_4_ * fVar140,
                                                          CONCAT44(auVar97._4_4_ * fVar94,
                                                                   auVar97._0_4_ * fVar129)))),
                              auVar84,ZEXT1632(auVar76));
    auVar170 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar145._12_4_ * fVar123,
                                                  CONCAT48(auVar145._8_4_ * fVar140,
                                                           CONCAT44(auVar145._4_4_ * fVar94,
                                                                    auVar145._0_4_ * fVar129)))),
                               auVar84,ZEXT1632(auVar79));
    auVar183 = vfmadd231ps_fma(auVar56,auVar84,ZEXT1632(auVar96));
    auVar184 = vfmadd231ps_fma(auVar239,ZEXT1632(auVar73),auVar84);
    auVar217 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar76));
    auVar84 = vsubps_avx(ZEXT1632(auVar145),ZEXT1632(auVar79));
    auVar178 = vsubps_avx(ZEXT1632(auVar171),ZEXT1632(auVar96));
    auVar203 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar73));
    local_780._0_4_ = fVar128 * auVar217._0_4_ * 3.0;
    local_780._4_4_ = fVar128 * auVar217._4_4_ * 3.0;
    local_780._8_4_ = fVar128 * auVar217._8_4_ * 3.0;
    local_780._12_4_ = fVar128 * auVar217._12_4_ * 3.0;
    local_780._16_4_ = fVar128 * auVar217._16_4_ * 3.0;
    local_780._20_4_ = fVar128 * auVar217._20_4_ * 3.0;
    local_780._24_4_ = fVar128 * auVar217._24_4_ * 3.0;
    local_780._28_4_ = 0;
    fVar197 = fVar128 * auVar84._0_4_ * 3.0;
    fVar207 = fVar128 * auVar84._4_4_ * 3.0;
    local_aa0._4_4_ = fVar207;
    local_aa0._0_4_ = fVar197;
    fVar208 = fVar128 * auVar84._8_4_ * 3.0;
    local_aa0._8_4_ = fVar208;
    fVar209 = fVar128 * auVar84._12_4_ * 3.0;
    local_aa0._12_4_ = fVar209;
    fVar210 = fVar128 * auVar84._16_4_ * 3.0;
    local_aa0._16_4_ = fVar210;
    fVar211 = fVar128 * auVar84._20_4_ * 3.0;
    local_aa0._20_4_ = fVar211;
    fVar212 = fVar128 * auVar84._24_4_ * 3.0;
    local_aa0._24_4_ = fVar212;
    local_aa0._28_4_ = auVar178._28_4_;
    auVar235._0_4_ = fVar128 * auVar178._0_4_ * 3.0;
    auVar235._4_4_ = fVar128 * auVar178._4_4_ * 3.0;
    auVar235._8_4_ = fVar128 * auVar178._8_4_ * 3.0;
    auVar235._12_4_ = fVar128 * auVar178._12_4_ * 3.0;
    auVar235._16_4_ = fVar128 * auVar178._16_4_ * 3.0;
    auVar235._20_4_ = fVar128 * auVar178._20_4_ * 3.0;
    auVar235._24_4_ = fVar128 * auVar178._24_4_ * 3.0;
    auVar235._28_4_ = 0;
    fVar94 = fVar128 * auVar203._0_4_ * 3.0;
    fVar123 = fVar128 * auVar203._4_4_ * 3.0;
    auVar162._4_4_ = fVar123;
    auVar162._0_4_ = fVar94;
    fVar124 = fVar128 * auVar203._8_4_ * 3.0;
    auVar162._8_4_ = fVar124;
    fVar125 = fVar128 * auVar203._12_4_ * 3.0;
    auVar162._12_4_ = fVar125;
    fVar126 = fVar128 * auVar203._16_4_ * 3.0;
    auVar162._16_4_ = fVar126;
    fVar127 = fVar128 * auVar203._20_4_ * 3.0;
    auVar162._20_4_ = fVar127;
    fVar128 = fVar128 * auVar203._24_4_ * 3.0;
    auVar162._24_4_ = fVar128;
    auVar162._28_4_ = auVar217._28_4_;
    auVar160 = ZEXT1632(auVar95);
    auVar11 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar95));
    _local_940 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar170));
    local_a80 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar183));
    local_300 = vsubps_avx(auVar11,auVar160);
    local_2e0 = vsubps_avx(local_a80,ZEXT1632(auVar183));
    fVar129 = local_2e0._0_4_;
    fVar140 = local_2e0._4_4_;
    auVar268._4_4_ = local_780._4_4_ * fVar140;
    auVar268._0_4_ = local_780._0_4_ * fVar129;
    fVar141 = local_2e0._8_4_;
    auVar268._8_4_ = local_780._8_4_ * fVar141;
    fVar142 = local_2e0._12_4_;
    auVar268._12_4_ = local_780._12_4_ * fVar142;
    fVar144 = local_2e0._16_4_;
    auVar268._16_4_ = local_780._16_4_ * fVar144;
    fVar169 = local_2e0._20_4_;
    auVar268._20_4_ = local_780._20_4_ * fVar169;
    fVar143 = local_2e0._24_4_;
    auVar268._24_4_ = local_780._24_4_ * fVar143;
    auVar268._28_4_ = local_a80._28_4_;
    auVar76 = vfmsub231ps_fma(auVar268,auVar235,local_300);
    local_320 = vsubps_avx(_local_940,ZEXT1632(auVar170));
    fVar246 = local_300._0_4_;
    fVar247 = local_300._4_4_;
    auVar10._4_4_ = fVar247 * fVar207;
    auVar10._0_4_ = fVar246 * fVar197;
    fVar248 = local_300._8_4_;
    auVar10._8_4_ = fVar248 * fVar208;
    fVar250 = local_300._12_4_;
    auVar10._12_4_ = fVar250 * fVar209;
    fVar252 = local_300._16_4_;
    auVar10._16_4_ = fVar252 * fVar210;
    fVar249 = local_300._20_4_;
    auVar10._20_4_ = fVar249 * fVar211;
    fVar251 = local_300._24_4_;
    auVar10._24_4_ = fVar251 * fVar212;
    auVar10._28_4_ = auVar11._28_4_;
    auVar79 = vfmsub231ps_fma(auVar10,local_780,local_320);
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar79._12_4_ * auVar79._12_4_,
                                                 CONCAT48(auVar79._8_4_ * auVar79._8_4_,
                                                          CONCAT44(auVar79._4_4_ * auVar79._4_4_,
                                                                   auVar79._0_4_ * auVar79._0_4_))))
                              ,ZEXT1632(auVar76),ZEXT1632(auVar76));
    auVar161._0_4_ = fVar129 * fVar129;
    auVar161._4_4_ = fVar140 * fVar140;
    auVar161._8_4_ = fVar141 * fVar141;
    auVar161._12_4_ = fVar142 * fVar142;
    auVar161._16_4_ = fVar144 * fVar144;
    auVar161._20_4_ = fVar169 * fVar169;
    auVar161._24_4_ = fVar143 * fVar143;
    auVar161._28_4_ = 0;
    auVar79 = vfmadd231ps_fma(auVar161,local_320,local_320);
    auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),local_300,local_300);
    fVar197 = local_320._0_4_;
    fVar207 = local_320._4_4_;
    auVar13._4_4_ = fVar207 * auVar235._4_4_;
    auVar13._0_4_ = fVar197 * auVar235._0_4_;
    fVar208 = local_320._8_4_;
    auVar13._8_4_ = fVar208 * auVar235._8_4_;
    fVar209 = local_320._12_4_;
    auVar13._12_4_ = fVar209 * auVar235._12_4_;
    fVar210 = local_320._16_4_;
    auVar13._16_4_ = fVar210 * auVar235._16_4_;
    fVar211 = local_320._20_4_;
    auVar13._20_4_ = fVar211 * auVar235._20_4_;
    fVar212 = local_320._24_4_;
    auVar13._24_4_ = fVar212 * auVar235._24_4_;
    auVar13._28_4_ = local_940._28_4_;
    auVar84 = vrcpps_avx(ZEXT1632(auVar79));
    auVar96 = vfmsub231ps_fma(auVar13,local_aa0,local_2e0);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar76),ZEXT1632(auVar96),ZEXT1632(auVar96));
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar262._16_4_ = 0x3f800000;
    auVar262._20_4_ = 0x3f800000;
    auVar262._24_4_ = 0x3f800000;
    auVar262._28_4_ = 0x3f800000;
    auVar76 = vfnmadd213ps_fma(auVar84,ZEXT1632(auVar79),auVar262);
    auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar84,auVar84);
    local_9c0 = vpermps_avx2(_DAT_01fb7720,local_780);
    local_a00 = vpermps_avx2(_DAT_01fb7720,auVar235);
    auVar14._4_4_ = local_9c0._4_4_ * fVar140;
    auVar14._0_4_ = local_9c0._0_4_ * fVar129;
    auVar14._8_4_ = local_9c0._8_4_ * fVar141;
    auVar14._12_4_ = local_9c0._12_4_ * fVar142;
    auVar14._16_4_ = local_9c0._16_4_ * fVar144;
    auVar14._20_4_ = local_9c0._20_4_ * fVar169;
    auVar14._24_4_ = local_9c0._24_4_ * fVar143;
    auVar14._28_4_ = auVar84._28_4_;
    auVar73 = vfmsub231ps_fma(auVar14,local_a00,local_300);
    local_a20 = vpermps_avx2(_DAT_01fb7720,local_aa0);
    auVar15._4_4_ = fVar247 * local_a20._4_4_;
    auVar15._0_4_ = fVar246 * local_a20._0_4_;
    auVar15._8_4_ = fVar248 * local_a20._8_4_;
    auVar15._12_4_ = fVar250 * local_a20._12_4_;
    auVar15._16_4_ = fVar252 * local_a20._16_4_;
    auVar15._20_4_ = fVar249 * local_a20._20_4_;
    auVar15._24_4_ = fVar251 * local_a20._24_4_;
    auVar15._28_4_ = auVar178._28_4_;
    auVar97 = vfmsub231ps_fma(auVar15,local_9c0,local_320);
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar97._12_4_ * auVar97._12_4_,
                                                 CONCAT48(auVar97._8_4_ * auVar97._8_4_,
                                                          CONCAT44(auVar97._4_4_ * auVar97._4_4_,
                                                                   auVar97._0_4_ * auVar97._0_4_))))
                              ,ZEXT1632(auVar73),ZEXT1632(auVar73));
    auVar192._0_4_ = fVar197 * local_a00._0_4_;
    auVar192._4_4_ = fVar207 * local_a00._4_4_;
    auVar192._8_4_ = fVar208 * local_a00._8_4_;
    auVar192._12_4_ = fVar209 * local_a00._12_4_;
    auVar192._16_4_ = fVar210 * local_a00._16_4_;
    auVar192._20_4_ = fVar211 * local_a00._20_4_;
    auVar192._24_4_ = fVar212 * local_a00._24_4_;
    auVar192._28_4_ = 0;
    auVar97 = vfmsub231ps_fma(auVar192,local_a20,local_2e0);
    auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),ZEXT1632(auVar97),ZEXT1632(auVar97));
    auVar84 = vmaxps_avx(ZEXT1632(CONCAT412(auVar96._12_4_ * auVar76._12_4_,
                                            CONCAT48(auVar96._8_4_ * auVar76._8_4_,
                                                     CONCAT44(auVar96._4_4_ * auVar76._4_4_,
                                                              auVar96._0_4_ * auVar76._0_4_)))),
                         ZEXT1632(CONCAT412(auVar73._12_4_ * auVar76._12_4_,
                                            CONCAT48(auVar73._8_4_ * auVar76._8_4_,
                                                     CONCAT44(auVar73._4_4_ * auVar76._4_4_,
                                                              auVar73._0_4_ * auVar76._0_4_)))));
    local_800._0_4_ = auVar184._0_4_ + fVar94;
    local_800._4_4_ = auVar184._4_4_ + fVar123;
    local_800._8_4_ = auVar184._8_4_ + fVar124;
    local_800._12_4_ = auVar184._12_4_ + fVar125;
    local_800._16_4_ = fVar126 + 0.0;
    local_800._20_4_ = fVar127 + 0.0;
    local_800._24_4_ = fVar128 + 0.0;
    local_800._28_4_ = auVar217._28_4_ + 0.0;
    local_7e0 = ZEXT1632(auVar184);
    auVar217 = vsubps_avx(local_7e0,auVar162);
    auVar227 = vpermps_avx2(_DAT_01fb7720,auVar217);
    auVar205 = vpermps_avx2(_DAT_01fb7720,local_7e0);
    auVar217 = vmaxps_avx(local_7e0,local_800);
    auVar203 = vrsqrtps_avx(ZEXT1632(auVar79));
    auVar178 = vmaxps_avx(auVar227,auVar205);
    auVar217 = vmaxps_avx(auVar217,auVar178);
    fVar94 = auVar203._0_4_;
    fVar123 = auVar203._4_4_;
    fVar128 = auVar203._8_4_;
    fVar124 = auVar203._12_4_;
    fVar125 = auVar203._16_4_;
    fVar126 = auVar203._20_4_;
    fVar127 = auVar203._24_4_;
    auVar54._4_4_ = fVar123 * fVar123 * fVar123 * auVar79._4_4_ * -0.5;
    auVar54._0_4_ = fVar94 * fVar94 * fVar94 * auVar79._0_4_ * -0.5;
    auVar54._8_4_ = fVar128 * fVar128 * fVar128 * auVar79._8_4_ * -0.5;
    auVar54._12_4_ = fVar124 * fVar124 * fVar124 * auVar79._12_4_ * -0.5;
    auVar54._16_4_ = fVar125 * fVar125 * fVar125 * -0.0;
    auVar54._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
    auVar54._24_4_ = fVar127 * fVar127 * fVar127 * -0.0;
    auVar54._28_4_ = DAT_01fb7720._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar76 = vfmadd231ps_fma(auVar54,auVar111,auVar203);
    auVar232 = ZEXT1664(auVar76);
    fVar94 = auVar76._0_4_;
    fVar123 = auVar76._4_4_;
    auVar16._4_4_ = fVar207 * fVar123;
    auVar16._0_4_ = fVar197 * fVar94;
    fVar128 = auVar76._8_4_;
    auVar16._8_4_ = fVar208 * fVar128;
    fVar124 = auVar76._12_4_;
    auVar16._12_4_ = fVar209 * fVar124;
    auVar16._16_4_ = fVar210 * 0.0;
    auVar16._20_4_ = fVar211 * 0.0;
    auVar16._24_4_ = fVar212 * 0.0;
    auVar16._28_4_ = 0;
    auVar17._4_4_ = (float)local_8a0._4_4_ * fVar123 * fVar140;
    auVar17._0_4_ = (float)local_8a0._0_4_ * fVar94 * fVar129;
    auVar17._8_4_ = fStack_898 * fVar128 * fVar141;
    auVar17._12_4_ = fStack_894 * fVar124 * fVar142;
    auVar17._16_4_ = fStack_890 * fVar144 * 0.0;
    auVar17._20_4_ = fStack_88c * fVar169 * 0.0;
    auVar17._24_4_ = fStack_888 * fVar143 * 0.0;
    auVar17._28_4_ = local_320._28_4_;
    auVar79 = vfmadd231ps_fma(auVar17,auVar16,_local_640);
    local_600 = ZEXT1632(auVar183);
    auVar203 = vsubps_avx(ZEXT832(0) << 0x20,local_600);
    fVar125 = auVar203._0_4_;
    auVar267._0_4_ = fVar125 * fVar94 * fVar129;
    fVar126 = auVar203._4_4_;
    auVar267._4_4_ = fVar126 * fVar123 * fVar140;
    fVar127 = auVar203._8_4_;
    auVar267._8_4_ = fVar127 * fVar128 * fVar141;
    fVar197 = auVar203._12_4_;
    auVar267._12_4_ = fVar197 * fVar124 * fVar142;
    fVar207 = auVar203._16_4_;
    auVar267._16_4_ = fVar207 * fVar144 * 0.0;
    fVar144 = auVar203._20_4_;
    auVar267._20_4_ = fVar144 * fVar169 * 0.0;
    fVar169 = auVar203._24_4_;
    auVar267._24_4_ = fVar169 * fVar143 * 0.0;
    auVar267._28_4_ = 0;
    local_620 = ZEXT1632(auVar170);
    auVar164 = vsubps_avx(ZEXT832(0) << 0x20,local_620);
    auVar96 = vfmadd231ps_fma(auVar267,auVar164,auVar16);
    auVar18._4_4_ = fVar247 * fVar123;
    auVar18._0_4_ = fVar246 * fVar94;
    auVar18._8_4_ = fVar248 * fVar128;
    auVar18._12_4_ = fVar250 * fVar124;
    auVar18._16_4_ = fVar252 * 0.0;
    auVar18._20_4_ = fVar249 * 0.0;
    auVar18._24_4_ = fVar251 * 0.0;
    auVar18._28_4_ = auVar178._28_4_;
    auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar18,_local_660);
    auVar242 = ZEXT1664(auVar79);
    auVar162 = ZEXT832(0) << 0x20;
    auVar167 = vsubps_avx(auVar162,auVar160);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar167,auVar18);
    auVar19._4_4_ = (float)local_8a0._4_4_ * fVar126;
    auVar19._0_4_ = (float)local_8a0._0_4_ * fVar125;
    auVar19._8_4_ = fStack_898 * fVar127;
    auVar19._12_4_ = fStack_894 * fVar197;
    auVar19._16_4_ = fStack_890 * fVar207;
    auVar19._20_4_ = fStack_88c * fVar144;
    auVar19._24_4_ = fStack_888 * fVar169;
    auVar19._28_4_ = auVar178._28_4_;
    auVar73 = vfmadd231ps_fma(auVar19,_local_640,auVar164);
    auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),_local_660,auVar167);
    fVar129 = auVar96._0_4_;
    fVar210 = auVar79._0_4_;
    fVar140 = auVar96._4_4_;
    fVar211 = auVar79._4_4_;
    fVar141 = auVar96._8_4_;
    fVar212 = auVar79._8_4_;
    fVar142 = auVar96._12_4_;
    fVar246 = auVar79._12_4_;
    auVar20._28_4_ = local_640._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * fVar142,
                            CONCAT48(fVar212 * fVar141,CONCAT44(fVar211 * fVar140,fVar210 * fVar129)
                                    )));
    auVar178 = vsubps_avx(ZEXT1632(auVar73),auVar20);
    auVar21._4_4_ = fVar126 * fVar126;
    auVar21._0_4_ = fVar125 * fVar125;
    auVar21._8_4_ = fVar127 * fVar127;
    auVar21._12_4_ = fVar197 * fVar197;
    auVar21._16_4_ = fVar207 * fVar207;
    auVar21._20_4_ = fVar144 * fVar144;
    auVar21._24_4_ = fVar169 * fVar169;
    auVar21._28_4_ = local_640._28_4_;
    auVar73 = vfmadd231ps_fma(auVar21,auVar164,auVar164);
    auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar167,auVar167);
    auVar22._28_4_ = local_300._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar142 * fVar142,
                            CONCAT48(fVar141 * fVar141,CONCAT44(fVar140 * fVar140,fVar129 * fVar129)
                                    )));
    auVar181 = vsubps_avx(ZEXT1632(auVar73),auVar22);
    local_5c0 = vsqrtps_avx(auVar84);
    fVar129 = (auVar217._0_4_ + local_5c0._0_4_) * 1.0000002;
    fVar140 = (auVar217._4_4_ + local_5c0._4_4_) * 1.0000002;
    fVar141 = (auVar217._8_4_ + local_5c0._8_4_) * 1.0000002;
    fVar142 = (auVar217._12_4_ + local_5c0._12_4_) * 1.0000002;
    fVar143 = (auVar217._16_4_ + local_5c0._16_4_) * 1.0000002;
    fVar208 = (auVar217._20_4_ + local_5c0._20_4_) * 1.0000002;
    fVar209 = (auVar217._24_4_ + local_5c0._24_4_) * 1.0000002;
    auVar23._4_4_ = fVar140 * fVar140;
    auVar23._0_4_ = fVar129 * fVar129;
    auVar23._8_4_ = fVar141 * fVar141;
    auVar23._12_4_ = fVar142 * fVar142;
    auVar23._16_4_ = fVar143 * fVar143;
    auVar23._20_4_ = fVar208 * fVar208;
    auVar23._24_4_ = fVar209 * fVar209;
    auVar23._28_4_ = auVar217._28_4_ + local_5c0._28_4_;
    local_360._0_4_ = auVar178._0_4_ + auVar178._0_4_;
    local_360._4_4_ = auVar178._4_4_ + auVar178._4_4_;
    local_360._8_4_ = auVar178._8_4_ + auVar178._8_4_;
    local_360._12_4_ = auVar178._12_4_ + auVar178._12_4_;
    local_360._16_4_ = auVar178._16_4_ + auVar178._16_4_;
    local_360._20_4_ = auVar178._20_4_ + auVar178._20_4_;
    local_360._24_4_ = auVar178._24_4_ + auVar178._24_4_;
    fVar129 = auVar178._28_4_;
    local_360._28_4_ = fVar129 + fVar129;
    auVar178 = vsubps_avx(auVar181,auVar23);
    auVar239 = ZEXT1632(auVar79);
    local_340._28_4_ = auVar217._28_4_;
    local_340._0_28_ =
         ZEXT1628(CONCAT412(fVar246 * fVar246,
                            CONCAT48(fVar212 * fVar212,CONCAT44(fVar211 * fVar211,fVar210 * fVar210)
                                    )));
    local_ac0 = vsubps_avx(local_280,local_340);
    auVar24._4_4_ = local_360._4_4_ * local_360._4_4_;
    auVar24._0_4_ = local_360._0_4_ * local_360._0_4_;
    auVar24._8_4_ = local_360._8_4_ * local_360._8_4_;
    auVar24._12_4_ = local_360._12_4_ * local_360._12_4_;
    auVar24._16_4_ = local_360._16_4_ * local_360._16_4_;
    auVar24._20_4_ = local_360._20_4_ * local_360._20_4_;
    auVar24._24_4_ = local_360._24_4_ * local_360._24_4_;
    auVar24._28_4_ = fVar129;
    fVar129 = local_ac0._0_4_;
    local_5e0._0_4_ = fVar129 * 4.0;
    fVar140 = local_ac0._4_4_;
    local_5e0._4_4_ = fVar140 * 4.0;
    fVar141 = local_ac0._8_4_;
    fStack_5d8 = fVar141 * 4.0;
    fVar142 = local_ac0._12_4_;
    fStack_5d4 = fVar142 * 4.0;
    fVar143 = local_ac0._16_4_;
    fStack_5d0 = fVar143 * 4.0;
    fVar208 = local_ac0._20_4_;
    fStack_5cc = fVar208 * 4.0;
    fVar209 = local_ac0._24_4_;
    fStack_5c8 = fVar209 * 4.0;
    uStack_5c4 = 0x40800000;
    auVar25._4_4_ = (float)local_5e0._4_4_ * auVar178._4_4_;
    auVar25._0_4_ = (float)local_5e0._0_4_ * auVar178._0_4_;
    auVar25._8_4_ = fStack_5d8 * auVar178._8_4_;
    auVar25._12_4_ = fStack_5d4 * auVar178._12_4_;
    auVar25._16_4_ = fStack_5d0 * auVar178._16_4_;
    auVar25._20_4_ = fStack_5cc * auVar178._20_4_;
    auVar25._24_4_ = fStack_5c8 * auVar178._24_4_;
    auVar25._28_4_ = 0x40800000;
    auVar217 = vsubps_avx(auVar24,auVar25);
    auVar84 = vcmpps_avx(auVar217,auVar162,5);
    local_6a0._8_4_ = 0x80000000;
    local_6a0._0_8_ = 0x8000000080000000;
    local_6a0._12_4_ = 0x80000000;
    local_6a0._16_4_ = 0x80000000;
    local_6a0._20_4_ = 0x80000000;
    local_6a0._24_4_ = 0x80000000;
    local_6a0._28_4_ = 0x80000000;
    local_380._0_4_ = fVar129 + fVar129;
    local_380._4_4_ = fVar140 + fVar140;
    local_380._8_4_ = fVar141 + fVar141;
    local_380._12_4_ = fVar142 + fVar142;
    local_380._16_4_ = fVar143 + fVar143;
    local_380._20_4_ = fVar208 + fVar208;
    local_380._24_4_ = fVar209 + fVar209;
    local_380._28_4_ = local_ac0._28_4_ + local_ac0._28_4_;
    auVar268 = ZEXT1632(auVar96);
    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0x7f,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar84 >> 0xbf,0) == '\0') &&
        (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f]) {
      auVar255._8_4_ = 0x7f800000;
      auVar255._0_8_ = 0x7f8000007f800000;
      auVar255._12_4_ = 0x7f800000;
      auVar255._16_4_ = 0x7f800000;
      auVar255._20_4_ = 0x7f800000;
      auVar255._24_4_ = 0x7f800000;
      auVar255._28_4_ = 0x7f800000;
      auVar226._8_4_ = 0xff800000;
      auVar226._0_8_ = 0xff800000ff800000;
      auVar226._12_4_ = 0xff800000;
      auVar226._16_4_ = 0xff800000;
      auVar226._20_4_ = 0xff800000;
      auVar226._24_4_ = 0xff800000;
      auVar226._28_4_ = 0xff800000;
      auVar245 = ZEXT3264(CONCAT824(uStack_948,CONCAT816(uStack_950,CONCAT88(uStack_958,local_960)))
                         );
      auVar237 = ZEXT3264(auVar84);
    }
    else {
      auVar10 = vsqrtps_avx(auVar217);
      auVar162 = vcmpps_avx(auVar217,auVar162,5);
      auVar217 = vrcpps_avx(local_380);
      auVar218._8_4_ = 0x3f800000;
      auVar218._0_8_ = 0x3f8000003f800000;
      auVar218._12_4_ = 0x3f800000;
      auVar218._16_4_ = 0x3f800000;
      auVar218._20_4_ = 0x3f800000;
      auVar218._24_4_ = 0x3f800000;
      auVar218._28_4_ = 0x3f800000;
      auVar79 = vfnmadd213ps_fma(auVar217,local_380,auVar218);
      auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar217,auVar217);
      uVar62 = CONCAT44(local_360._4_4_,local_360._0_4_);
      auVar263._0_8_ = uVar62 ^ 0x8000000080000000;
      auVar263._8_4_ = -local_360._8_4_;
      auVar263._12_4_ = -local_360._12_4_;
      auVar263._16_4_ = -local_360._16_4_;
      auVar263._20_4_ = -local_360._20_4_;
      auVar263._24_4_ = -local_360._24_4_;
      auVar263._28_4_ = -local_360._28_4_;
      auVar217 = vsubps_avx(auVar263,auVar10);
      auVar26._4_4_ = auVar217._4_4_ * auVar79._4_4_;
      auVar26._0_4_ = auVar217._0_4_ * auVar79._0_4_;
      auVar26._8_4_ = auVar217._8_4_ * auVar79._8_4_;
      auVar26._12_4_ = auVar217._12_4_ * auVar79._12_4_;
      auVar26._16_4_ = auVar217._16_4_ * 0.0;
      auVar26._20_4_ = auVar217._20_4_ * 0.0;
      auVar26._24_4_ = auVar217._24_4_ * 0.0;
      auVar26._28_4_ = auVar217._28_4_;
      auVar217 = vsubps_avx(auVar10,local_360);
      auVar244._0_4_ = auVar79._0_4_ * auVar217._0_4_;
      auVar244._4_4_ = auVar79._4_4_ * auVar217._4_4_;
      auVar244._8_4_ = auVar79._8_4_ * auVar217._8_4_;
      auVar244._12_4_ = auVar79._12_4_ * auVar217._12_4_;
      auVar244._16_4_ = auVar217._16_4_ * 0.0;
      auVar244._20_4_ = auVar217._20_4_ * 0.0;
      auVar244._24_4_ = auVar217._24_4_ * 0.0;
      auVar244._28_4_ = 0;
      auVar79 = vfmadd213ps_fma(auVar239,auVar26,auVar268);
      local_400 = ZEXT1632(CONCAT412(fVar124 * auVar79._12_4_,
                                     CONCAT48(fVar128 * auVar79._8_4_,
                                              CONCAT44(fVar123 * auVar79._4_4_,
                                                       fVar94 * auVar79._0_4_))));
      auVar217 = vandps_avx(local_340,local_680);
      auVar217 = vmaxps_avx(local_580,auVar217);
      auVar27._4_4_ = auVar217._4_4_ * 1.9073486e-06;
      auVar27._0_4_ = auVar217._0_4_ * 1.9073486e-06;
      auVar27._8_4_ = auVar217._8_4_ * 1.9073486e-06;
      auVar27._12_4_ = auVar217._12_4_ * 1.9073486e-06;
      auVar27._16_4_ = auVar217._16_4_ * 1.9073486e-06;
      auVar27._20_4_ = auVar217._20_4_ * 1.9073486e-06;
      auVar27._24_4_ = auVar217._24_4_ * 1.9073486e-06;
      auVar27._28_4_ = auVar217._28_4_;
      auVar217 = vandps_avx(local_680,local_ac0);
      auVar217 = vcmpps_avx(auVar217,auVar27,1);
      auVar79 = vfmadd213ps_fma(auVar239,auVar244,auVar268);
      auVar219._8_4_ = 0x7f800000;
      auVar219._0_8_ = 0x7f8000007f800000;
      auVar219._12_4_ = 0x7f800000;
      auVar219._16_4_ = 0x7f800000;
      auVar219._20_4_ = 0x7f800000;
      auVar219._24_4_ = 0x7f800000;
      auVar219._28_4_ = 0x7f800000;
      auVar255 = vblendvps_avx(auVar219,auVar26,auVar162);
      local_420 = fVar94 * auVar79._0_4_;
      fStack_41c = fVar123 * auVar79._4_4_;
      fStack_418 = fVar128 * auVar79._8_4_;
      fStack_414 = fVar124 * auVar79._12_4_;
      uStack_410 = 0;
      uStack_40c = 0;
      uStack_408 = 0;
      uStack_404 = auVar255._28_4_;
      auVar256._8_4_ = 0xff800000;
      auVar256._0_8_ = 0xff800000ff800000;
      auVar256._12_4_ = 0xff800000;
      auVar256._16_4_ = 0xff800000;
      auVar256._20_4_ = 0xff800000;
      auVar256._24_4_ = 0xff800000;
      auVar256._28_4_ = 0xff800000;
      auVar226 = vblendvps_avx(auVar256,auVar244,auVar162);
      auVar10 = auVar162 & auVar217;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar10 >> 0x7f,0) == '\0') &&
            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar10 >> 0xbf,0) == '\0') &&
          (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar10[0x1f])
      {
        auVar245 = ZEXT3264(CONCAT824(uStack_948,
                                      CONCAT816(uStack_950,CONCAT88(uStack_958,local_960))));
        auVar237 = ZEXT3264(auVar84);
      }
      else {
        auVar84 = vandps_avx(auVar217,auVar162);
        auVar178 = vcmpps_avx(auVar178,_DAT_01f7b000,2);
        auVar265._8_4_ = 0xff800000;
        auVar265._0_8_ = 0xff800000ff800000;
        auVar265._12_4_ = 0xff800000;
        auVar265._16_4_ = 0xff800000;
        auVar265._20_4_ = 0xff800000;
        auVar265._24_4_ = 0xff800000;
        auVar265._28_4_ = 0xff800000;
        auVar223._8_4_ = 0x7f800000;
        auVar223._0_8_ = 0x7f8000007f800000;
        auVar223._12_4_ = 0x7f800000;
        auVar223._16_4_ = 0x7f800000;
        auVar223._20_4_ = 0x7f800000;
        auVar223._24_4_ = 0x7f800000;
        auVar223._28_4_ = 0x7f800000;
        auVar217 = vblendvps_avx(auVar223,auVar265,auVar178);
        auVar79 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar79);
        auVar255 = vblendvps_avx(auVar255,auVar217,auVar10);
        auVar217 = vblendvps_avx(auVar265,auVar223,auVar178);
        auVar226 = vblendvps_avx(auVar226,auVar217,auVar10);
        auVar138._0_8_ = auVar84._0_8_ ^ 0xffffffffffffffff;
        auVar138._8_4_ = auVar84._8_4_ ^ 0xffffffff;
        auVar138._12_4_ = auVar84._12_4_ ^ 0xffffffff;
        auVar138._16_4_ = auVar84._16_4_ ^ 0xffffffff;
        auVar138._20_4_ = auVar84._20_4_ ^ 0xffffffff;
        auVar138._24_4_ = auVar84._24_4_ ^ 0xffffffff;
        auVar138._28_4_ = auVar84._28_4_ ^ 0xffffffff;
        auVar84 = vorps_avx(auVar178,auVar138);
        auVar84 = vandps_avx(auVar162,auVar84);
        auVar237 = ZEXT3264(auVar84);
        auVar245 = ZEXT3264(CONCAT824(uStack_948,
                                      CONCAT816(uStack_950,CONCAT88(uStack_958,local_960))));
      }
    }
    auVar217 = auVar237._0_32_;
    auVar84 = local_520 & auVar217;
    fVar129 = (float)local_8c0._0_4_;
    fVar140 = (float)local_8c0._4_4_;
    fVar141 = fStack_8b8;
    fVar142 = fStack_8b4;
    fVar143 = fStack_8b0;
    fVar208 = fStack_8ac;
    fVar209 = fStack_8a8;
    fVar210 = fStack_8a4;
    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0x7f,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar84 >> 0xbf,0) == '\0') &&
        (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f]) {
LAB_01193064:
      auVar206 = ZEXT3264(local_9e0);
      auVar258 = ZEXT3264(auVar254);
    }
    else {
      local_440 = ZEXT1632(auVar76);
      auVar232 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar211 = *(float *)(ray + k * 4 + 0x80) - (float)local_910._0_4_;
      auVar193._4_4_ = fVar211;
      auVar193._0_4_ = fVar211;
      auVar193._8_4_ = fVar211;
      auVar193._12_4_ = fVar211;
      auVar193._16_4_ = fVar211;
      auVar193._20_4_ = fVar211;
      auVar193._24_4_ = fVar211;
      auVar193._28_4_ = fVar211;
      auVar162 = vminps_avx(auVar193,auVar226);
      auVar28._4_4_ = fVar126 * auVar235._4_4_;
      auVar28._0_4_ = fVar125 * auVar235._0_4_;
      auVar28._8_4_ = fVar127 * auVar235._8_4_;
      auVar28._12_4_ = fVar197 * auVar235._12_4_;
      auVar28._16_4_ = fVar207 * auVar235._16_4_;
      auVar28._20_4_ = fVar144 * auVar235._20_4_;
      auVar28._24_4_ = fVar169 * auVar235._24_4_;
      auVar28._28_4_ = auVar203._28_4_;
      auVar76 = vfmadd213ps_fma(auVar164,local_aa0,auVar28);
      auVar50._4_4_ = fStack_3dc;
      auVar50._0_4_ = local_3e0;
      auVar50._8_4_ = fStack_3d8;
      auVar50._12_4_ = fStack_3d4;
      auVar50._16_4_ = fStack_3d0;
      auVar50._20_4_ = fStack_3cc;
      auVar50._24_4_ = fStack_3c8;
      auVar50._28_4_ = fStack_3c4;
      auVar203 = vmaxps_avx(auVar50,auVar255);
      auVar79 = vfmadd213ps_fma(auVar167,local_780,ZEXT1632(auVar76));
      auVar29._4_4_ = (float)local_8a0._4_4_ * auVar235._4_4_;
      auVar29._0_4_ = (float)local_8a0._0_4_ * auVar235._0_4_;
      auVar29._8_4_ = fStack_898 * auVar235._8_4_;
      auVar29._12_4_ = fStack_894 * auVar235._12_4_;
      auVar29._16_4_ = fStack_890 * auVar235._16_4_;
      auVar29._20_4_ = fStack_88c * auVar235._20_4_;
      auVar29._24_4_ = fStack_888 * auVar235._24_4_;
      auVar29._28_4_ = 0;
      auVar237 = ZEXT3264(_local_640);
      auVar76 = vfmadd231ps_fma(auVar29,_local_640,local_aa0);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar76),_local_660,local_780);
      auVar84 = vandps_avx(ZEXT1632(auVar96),local_680);
      auVar220._8_4_ = 0x219392ef;
      auVar220._0_8_ = 0x219392ef219392ef;
      auVar220._12_4_ = 0x219392ef;
      auVar220._16_4_ = 0x219392ef;
      auVar220._20_4_ = 0x219392ef;
      auVar220._24_4_ = 0x219392ef;
      auVar220._28_4_ = 0x219392ef;
      auVar178 = vcmpps_avx(auVar84,auVar220,1);
      auVar84 = vrcpps_avx(ZEXT1632(auVar96));
      auVar257._8_4_ = 0x3f800000;
      auVar257._0_8_ = 0x3f8000003f800000;
      auVar257._12_4_ = 0x3f800000;
      auVar257._16_4_ = 0x3f800000;
      auVar257._20_4_ = 0x3f800000;
      auVar257._24_4_ = 0x3f800000;
      auVar257._28_4_ = 0x3f800000;
      auVar164 = ZEXT1632(auVar96);
      auVar76 = vfnmadd213ps_fma(auVar84,auVar164,auVar257);
      auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar84,auVar84);
      auVar202._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
      auVar202._8_4_ = auVar96._8_4_ ^ 0x80000000;
      auVar202._12_4_ = auVar96._12_4_ ^ 0x80000000;
      auVar202._16_4_ = 0x80000000;
      auVar202._20_4_ = 0x80000000;
      auVar202._24_4_ = 0x80000000;
      auVar202._28_4_ = 0x80000000;
      auVar30._4_4_ = auVar76._4_4_ * -auVar79._4_4_;
      auVar30._0_4_ = auVar76._0_4_ * -auVar79._0_4_;
      auVar30._8_4_ = auVar76._8_4_ * -auVar79._8_4_;
      auVar30._12_4_ = auVar76._12_4_ * -auVar79._12_4_;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      auVar84 = vcmpps_avx(auVar164,auVar202,1);
      auVar84 = vorps_avx(auVar84,auVar178);
      auVar264._8_4_ = 0xff800000;
      auVar264._0_8_ = 0xff800000ff800000;
      auVar264._12_4_ = 0xff800000;
      auVar264._16_4_ = 0xff800000;
      auVar264._20_4_ = 0xff800000;
      auVar264._24_4_ = 0xff800000;
      auVar264._28_4_ = 0xff800000;
      auVar84 = vblendvps_avx(auVar30,auVar264,auVar84);
      auVar203 = vmaxps_avx(auVar203,auVar84);
      auVar84 = vcmpps_avx(auVar164,auVar202,6);
      auVar84 = vorps_avx(auVar178,auVar84);
      auVar179._8_4_ = 0x7f800000;
      auVar179._0_8_ = 0x7f8000007f800000;
      auVar179._12_4_ = 0x7f800000;
      auVar179._16_4_ = 0x7f800000;
      auVar179._20_4_ = 0x7f800000;
      auVar179._24_4_ = 0x7f800000;
      auVar179._28_4_ = 0x7f800000;
      auVar84 = vblendvps_avx(auVar30,auVar179,auVar84);
      auVar164 = vminps_avx(auVar162,auVar84);
      fVar144 = -local_a00._0_4_;
      fVar169 = -local_a00._4_4_;
      fVar125 = -local_a00._8_4_;
      fVar126 = -local_a00._12_4_;
      fVar127 = -local_a00._16_4_;
      fVar197 = -local_a00._20_4_;
      fVar207 = -local_a00._24_4_;
      auVar180._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
      auVar180._8_4_ = -local_a20._8_4_;
      auVar180._12_4_ = -local_a20._12_4_;
      auVar180._16_4_ = -local_a20._16_4_;
      auVar180._20_4_ = -local_a20._20_4_;
      auVar180._24_4_ = -local_a20._24_4_;
      auVar180._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar84 = vsubps_avx(ZEXT832(0) << 0x20,_local_940);
      auVar178 = vsubps_avx(ZEXT832(0) << 0x20,local_a80);
      auVar31._4_4_ = auVar178._4_4_ * fVar169;
      auVar31._0_4_ = auVar178._0_4_ * fVar144;
      auVar31._8_4_ = auVar178._8_4_ * fVar125;
      auVar31._12_4_ = auVar178._12_4_ * fVar126;
      auVar31._16_4_ = auVar178._16_4_ * fVar127;
      auVar31._20_4_ = auVar178._20_4_ * fVar197;
      auVar31._24_4_ = auVar178._24_4_ * fVar207;
      auVar31._28_4_ = auVar178._28_4_;
      auVar76 = vfmadd231ps_fma(auVar31,auVar180,auVar84);
      auVar194._0_8_ = local_9c0._0_8_ ^ 0x8000000080000000;
      auVar194._8_4_ = -local_9c0._8_4_;
      auVar194._12_4_ = -local_9c0._12_4_;
      auVar194._16_4_ = -local_9c0._16_4_;
      auVar194._20_4_ = -local_9c0._20_4_;
      auVar194._24_4_ = -local_9c0._24_4_;
      auVar194._28_4_ = local_9c0._28_4_ ^ 0x80000000;
      auVar84 = vsubps_avx(ZEXT832(0) << 0x20,auVar11);
      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar194,auVar84);
      auVar32._4_4_ = (float)local_8a0._4_4_ * fVar169;
      auVar32._0_4_ = (float)local_8a0._0_4_ * fVar144;
      auVar32._8_4_ = fStack_898 * fVar125;
      auVar32._12_4_ = fStack_894 * fVar126;
      auVar32._16_4_ = fStack_890 * fVar127;
      auVar32._20_4_ = fStack_88c * fVar197;
      auVar32._24_4_ = fStack_888 * fVar207;
      auVar32._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar76 = vfmadd231ps_fma(auVar32,_local_640,auVar180);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar76),_local_660,auVar194);
      auVar84 = vandps_avx(ZEXT1632(auVar96),local_680);
      auVar167 = vrcpps_avx(ZEXT1632(auVar96));
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar112._16_4_ = 0x219392ef;
      auVar112._20_4_ = 0x219392ef;
      auVar112._24_4_ = 0x219392ef;
      auVar112._28_4_ = 0x219392ef;
      auVar178 = vcmpps_avx(auVar84,auVar112,1);
      auVar162 = ZEXT1632(auVar96);
      auVar76 = vfnmadd213ps_fma(auVar167,auVar162,auVar257);
      auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar167,auVar167);
      auVar195._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
      auVar195._8_4_ = auVar96._8_4_ ^ 0x80000000;
      auVar195._12_4_ = auVar96._12_4_ ^ 0x80000000;
      auVar195._16_4_ = 0x80000000;
      auVar195._20_4_ = 0x80000000;
      auVar195._24_4_ = 0x80000000;
      auVar195._28_4_ = 0x80000000;
      auVar33._4_4_ = auVar76._4_4_ * -auVar79._4_4_;
      auVar33._0_4_ = auVar76._0_4_ * -auVar79._0_4_;
      auVar33._8_4_ = auVar76._8_4_ * -auVar79._8_4_;
      auVar33._12_4_ = auVar76._12_4_ * -auVar79._12_4_;
      auVar33._16_4_ = 0x80000000;
      auVar33._20_4_ = 0x80000000;
      auVar33._24_4_ = 0x80000000;
      auVar33._28_4_ = 0x80000000;
      auVar84 = vcmpps_avx(auVar162,auVar195,1);
      auVar84 = vorps_avx(auVar84,auVar178);
      auVar113._8_4_ = 0xff800000;
      auVar113._0_8_ = 0xff800000ff800000;
      auVar113._12_4_ = 0xff800000;
      auVar113._16_4_ = 0xff800000;
      auVar113._20_4_ = 0xff800000;
      auVar113._24_4_ = 0xff800000;
      auVar113._28_4_ = 0xff800000;
      auVar84 = vblendvps_avx(auVar33,auVar113,auVar84);
      local_a40 = vmaxps_avx(auVar203,auVar84);
      auVar84 = vcmpps_avx(auVar162,auVar195,6);
      auVar84 = vorps_avx(auVar178,auVar84);
      auVar134._8_4_ = 0x7f800000;
      auVar134._0_8_ = 0x7f8000007f800000;
      auVar134._12_4_ = 0x7f800000;
      auVar134._16_4_ = 0x7f800000;
      auVar134._20_4_ = 0x7f800000;
      auVar134._24_4_ = 0x7f800000;
      auVar134._28_4_ = 0x7f800000;
      auVar178 = vblendvps_avx(auVar33,auVar134,auVar84);
      auVar84 = vandps_avx(auVar217,local_520);
      local_460 = vminps_avx(auVar164,auVar178);
      auVar217 = vcmpps_avx(local_a40,local_460,2);
      auVar178 = auVar84 & auVar217;
      if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar178 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar178 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar178 >> 0x7f,0) == '\0') &&
            (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar178 >> 0xbf,0) == '\0') &&
          (auVar178 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar178[0x1f]) {
        auVar245 = ZEXT3264(CONCAT824(uStack_948,
                                      CONCAT816(uStack_950,CONCAT88(uStack_958,local_960))));
        goto LAB_01193064;
      }
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      auVar178 = vminps_avx(local_400,auVar204);
      auVar164 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar178 = vmaxps_avx(auVar178,ZEXT832(0) << 0x20);
      auVar49._4_4_ = fStack_41c;
      auVar49._0_4_ = local_420;
      auVar49._8_4_ = fStack_418;
      auVar49._12_4_ = fStack_414;
      auVar49._16_4_ = uStack_410;
      auVar49._20_4_ = uStack_40c;
      auVar49._24_4_ = uStack_408;
      auVar49._28_4_ = uStack_404;
      auVar203 = vminps_avx(auVar49,auVar204);
      auVar203 = vmaxps_avx(auVar203,ZEXT832(0) << 0x20);
      auVar34._4_4_ = (auVar178._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar178._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar178._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar178._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar178._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar178._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar178._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar178._28_4_ + 7.0;
      auVar76 = vfmadd213ps_fma(auVar34,local_7c0,local_7a0);
      auVar35._4_4_ = (auVar203._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar203._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar203._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar203._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar203._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar203._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar203._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar203._28_4_ + 7.0;
      auVar79 = vfmadd213ps_fma(auVar35,local_7c0,local_7a0);
      auVar178 = vminps_avx(local_7e0,local_800);
      auVar203 = vminps_avx(auVar227,auVar205);
      auVar178 = vminps_avx(auVar178,auVar203);
      auVar178 = vsubps_avx(auVar178,local_5c0);
      auVar84 = vandps_avx(auVar217,auVar84);
      local_1a0 = ZEXT1632(auVar76);
      local_1c0 = ZEXT1632(auVar79);
      auVar36._4_4_ = auVar178._4_4_ * 0.99999976;
      auVar36._0_4_ = auVar178._0_4_ * 0.99999976;
      auVar36._8_4_ = auVar178._8_4_ * 0.99999976;
      auVar36._12_4_ = auVar178._12_4_ * 0.99999976;
      auVar36._16_4_ = auVar178._16_4_ * 0.99999976;
      auVar36._20_4_ = auVar178._20_4_ * 0.99999976;
      auVar36._24_4_ = auVar178._24_4_ * 0.99999976;
      auVar36._28_4_ = auVar217._28_4_;
      auVar217 = vmaxps_avx(ZEXT832(0) << 0x20,auVar36);
      auVar37._4_4_ = auVar217._4_4_ * auVar217._4_4_;
      auVar37._0_4_ = auVar217._0_4_ * auVar217._0_4_;
      auVar37._8_4_ = auVar217._8_4_ * auVar217._8_4_;
      auVar37._12_4_ = auVar217._12_4_ * auVar217._12_4_;
      auVar37._16_4_ = auVar217._16_4_ * auVar217._16_4_;
      auVar37._20_4_ = auVar217._20_4_ * auVar217._20_4_;
      auVar37._24_4_ = auVar217._24_4_ * auVar217._24_4_;
      auVar37._28_4_ = auVar217._28_4_;
      auVar178 = vsubps_avx(auVar181,auVar37);
      auVar38._4_4_ = auVar178._4_4_ * (float)local_5e0._4_4_;
      auVar38._0_4_ = auVar178._0_4_ * (float)local_5e0._0_4_;
      auVar38._8_4_ = auVar178._8_4_ * fStack_5d8;
      auVar38._12_4_ = auVar178._12_4_ * fStack_5d4;
      auVar38._16_4_ = auVar178._16_4_ * fStack_5d0;
      auVar38._20_4_ = auVar178._20_4_ * fStack_5cc;
      auVar38._24_4_ = auVar178._24_4_ * fStack_5c8;
      auVar38._28_4_ = auVar217._28_4_;
      auVar203 = vsubps_avx(auVar24,auVar38);
      local_9a0 = vcmpps_avx(auVar203,ZEXT832(0) << 0x20,5);
      auVar217 = local_9a0;
      if ((((((((local_9a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9a0 >> 0x7f,0) == '\0') &&
            (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9a0 >> 0xbf,0) == '\0') &&
          (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9a0[0x1f]) {
        auVar205 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar191 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar181 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar227 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_c00 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar221._8_4_ = 0x7f800000;
        auVar221._0_8_ = 0x7f8000007f800000;
        auVar221._12_4_ = 0x7f800000;
        auVar221._16_4_ = 0x7f800000;
        auVar221._20_4_ = 0x7f800000;
        auVar221._24_4_ = 0x7f800000;
        auVar221._28_4_ = 0x7f800000;
        auVar240._8_4_ = 0xff800000;
        auVar240._0_8_ = 0xff800000ff800000;
        auVar240._12_4_ = 0xff800000;
        auVar240._16_4_ = 0xff800000;
        auVar240._20_4_ = 0xff800000;
        auVar240._24_4_ = 0xff800000;
        auVar240._28_4_ = 0xff800000;
        local_9a0 = auVar11;
      }
      else {
        auVar164 = vrcpps_avx(local_380);
        auVar165._8_4_ = 0x3f800000;
        auVar165._0_8_ = 0x3f8000003f800000;
        auVar165._12_4_ = 0x3f800000;
        auVar165._16_4_ = 0x3f800000;
        auVar165._20_4_ = 0x3f800000;
        auVar165._24_4_ = 0x3f800000;
        auVar165._28_4_ = 0x3f800000;
        auVar76 = vfnmadd213ps_fma(local_380,auVar164,auVar165);
        auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar164,auVar164);
        auVar164 = vsqrtps_avx(auVar203);
        uVar62 = CONCAT44(local_360._4_4_,local_360._0_4_);
        auVar166._0_8_ = uVar62 ^ 0x8000000080000000;
        auVar166._8_4_ = -local_360._8_4_;
        auVar166._12_4_ = -local_360._12_4_;
        auVar166._16_4_ = -local_360._16_4_;
        auVar166._20_4_ = -local_360._20_4_;
        auVar166._24_4_ = -local_360._24_4_;
        auVar166._28_4_ = -local_360._28_4_;
        auVar167 = vsubps_avx(auVar166,auVar164);
        auVar181 = vsubps_avx(auVar164,local_360);
        fVar144 = auVar167._0_4_ * auVar76._0_4_;
        fVar169 = auVar167._4_4_ * auVar76._4_4_;
        auVar39._4_4_ = fVar169;
        auVar39._0_4_ = fVar144;
        fVar125 = auVar167._8_4_ * auVar76._8_4_;
        auVar39._8_4_ = fVar125;
        fVar126 = auVar167._12_4_ * auVar76._12_4_;
        auVar39._12_4_ = fVar126;
        fVar127 = auVar167._16_4_ * 0.0;
        auVar39._16_4_ = fVar127;
        fVar197 = auVar167._20_4_ * 0.0;
        auVar39._20_4_ = fVar197;
        fVar207 = auVar167._24_4_ * 0.0;
        auVar39._24_4_ = fVar207;
        auVar39._28_4_ = auVar164._28_4_;
        fVar211 = auVar181._0_4_ * auVar76._0_4_;
        fVar212 = auVar181._4_4_ * auVar76._4_4_;
        auVar40._4_4_ = fVar212;
        auVar40._0_4_ = fVar211;
        fVar246 = auVar181._8_4_ * auVar76._8_4_;
        auVar40._8_4_ = fVar246;
        fVar247 = auVar181._12_4_ * auVar76._12_4_;
        auVar40._12_4_ = fVar247;
        fVar248 = auVar181._16_4_ * 0.0;
        auVar40._16_4_ = fVar248;
        fVar250 = auVar181._20_4_ * 0.0;
        auVar40._20_4_ = fVar250;
        fVar252 = auVar181._24_4_ * 0.0;
        auVar40._24_4_ = fVar252;
        auVar40._28_4_ = local_7a0._0_4_;
        auVar76 = vfmadd213ps_fma(auVar239,auVar39,auVar268);
        auVar79 = vfmadd213ps_fma(auVar239,auVar40,auVar268);
        auVar167 = ZEXT1632(CONCAT412(fVar124 * auVar76._12_4_,
                                      CONCAT48(fVar128 * auVar76._8_4_,
                                               CONCAT44(fVar123 * auVar76._4_4_,
                                                        fVar94 * auVar76._0_4_))));
        auVar164 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar124,
                                      CONCAT48(auVar79._8_4_ * fVar128,
                                               CONCAT44(auVar79._4_4_ * fVar123,
                                                        auVar79._0_4_ * fVar94))));
        auVar76 = vfmadd213ps_fma(local_300,auVar167,auVar160);
        auVar79 = vfmadd213ps_fma(local_300,auVar164,auVar160);
        auVar96 = vfmadd213ps_fma(local_320,auVar167,local_620);
        auVar73 = vfmadd213ps_fma(local_320,auVar164,local_620);
        auVar97 = vfmadd213ps_fma(auVar167,local_2e0,local_600);
        auVar145 = vfmadd213ps_fma(local_2e0,auVar164,local_600);
        auVar41._4_4_ = (float)local_660._4_4_ * fVar169;
        auVar41._0_4_ = (float)local_660._0_4_ * fVar144;
        auVar41._8_4_ = fStack_658 * fVar125;
        auVar41._12_4_ = fStack_654 * fVar126;
        auVar41._16_4_ = fStack_650 * fVar127;
        auVar41._20_4_ = fStack_64c * fVar197;
        auVar41._24_4_ = fStack_648 * fVar207;
        auVar41._28_4_ = 0;
        auVar181 = vsubps_avx(auVar41,ZEXT1632(auVar76));
        auVar196._0_4_ = (float)local_640._0_4_ * fVar144;
        auVar196._4_4_ = (float)local_640._4_4_ * fVar169;
        auVar196._8_4_ = fStack_638 * fVar125;
        auVar196._12_4_ = fStack_634 * fVar126;
        auVar196._16_4_ = fStack_630 * fVar127;
        auVar196._20_4_ = fStack_62c * fVar197;
        auVar196._24_4_ = fStack_628 * fVar207;
        auVar196._28_4_ = 0;
        auVar227 = vsubps_avx(auVar196,ZEXT1632(auVar96));
        auVar42._4_4_ = (float)local_8a0._4_4_ * fVar169;
        auVar42._0_4_ = (float)local_8a0._0_4_ * fVar144;
        auVar42._8_4_ = fStack_898 * fVar125;
        auVar42._12_4_ = fStack_894 * fVar126;
        auVar42._16_4_ = fStack_890 * fVar127;
        auVar42._20_4_ = fStack_88c * fVar197;
        auVar42._24_4_ = fStack_888 * fVar207;
        auVar42._28_4_ = 0;
        auVar164 = vsubps_avx(auVar42,ZEXT1632(auVar97));
        _local_c00 = auVar164._0_28_;
        auVar43._4_4_ = fVar212 * (float)local_660._4_4_;
        auVar43._0_4_ = fVar211 * (float)local_660._0_4_;
        auVar43._8_4_ = fVar246 * fStack_658;
        auVar43._12_4_ = fVar247 * fStack_654;
        auVar43._16_4_ = fVar248 * fStack_650;
        auVar43._20_4_ = fVar250 * fStack_64c;
        auVar43._24_4_ = fVar252 * fStack_648;
        auVar43._28_4_ = auVar164._28_4_;
        auVar164 = vsubps_avx(auVar43,ZEXT1632(auVar79));
        auVar44._4_4_ = (float)local_640._4_4_ * fVar212;
        auVar44._0_4_ = (float)local_640._0_4_ * fVar211;
        auVar44._8_4_ = fStack_638 * fVar246;
        auVar44._12_4_ = fStack_634 * fVar247;
        auVar44._16_4_ = fStack_630 * fVar248;
        auVar44._20_4_ = fStack_62c * fVar250;
        auVar44._24_4_ = fStack_628 * fVar252;
        auVar44._28_4_ = 0;
        auVar205 = vsubps_avx(auVar44,ZEXT1632(auVar73));
        auVar45._4_4_ = (float)local_8a0._4_4_ * fVar212;
        auVar45._0_4_ = (float)local_8a0._0_4_ * fVar211;
        auVar45._8_4_ = fStack_898 * fVar246;
        auVar45._12_4_ = fStack_894 * fVar247;
        auVar45._16_4_ = fStack_890 * fVar248;
        auVar45._20_4_ = fStack_88c * fVar250;
        auVar45._24_4_ = fStack_888 * fVar252;
        auVar45._28_4_ = 0;
        auVar167 = vsubps_avx(auVar45,ZEXT1632(auVar145));
        auVar191 = auVar167._0_28_;
        auVar167 = vcmpps_avx(auVar203,_DAT_01f7b000,5);
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar221 = vblendvps_avx(auVar222,auVar39,auVar167);
        auVar203 = vandps_avx(local_680,local_340);
        auVar203 = vmaxps_avx(local_580,auVar203);
        auVar46._4_4_ = auVar203._4_4_ * 1.9073486e-06;
        auVar46._0_4_ = auVar203._0_4_ * 1.9073486e-06;
        auVar46._8_4_ = auVar203._8_4_ * 1.9073486e-06;
        auVar46._12_4_ = auVar203._12_4_ * 1.9073486e-06;
        auVar46._16_4_ = auVar203._16_4_ * 1.9073486e-06;
        auVar46._20_4_ = auVar203._20_4_ * 1.9073486e-06;
        auVar46._24_4_ = auVar203._24_4_ * 1.9073486e-06;
        auVar46._28_4_ = auVar203._28_4_;
        auVar203 = vandps_avx(local_680,local_ac0);
        auVar203 = vcmpps_avx(auVar203,auVar46,1);
        auVar241._8_4_ = 0xff800000;
        auVar241._0_8_ = 0xff800000ff800000;
        auVar241._12_4_ = 0xff800000;
        auVar241._16_4_ = 0xff800000;
        auVar241._20_4_ = 0xff800000;
        auVar241._24_4_ = 0xff800000;
        auVar241._28_4_ = 0xff800000;
        auVar240 = vblendvps_avx(auVar241,auVar40,auVar167);
        auVar11 = auVar167 & auVar203;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar217 = vandps_avx(auVar167,auVar203);
          auVar203 = vcmpps_avx(auVar178,ZEXT832(0) << 0x20,2);
          auVar236._8_4_ = 0xff800000;
          auVar236._0_8_ = 0xff800000ff800000;
          auVar236._12_4_ = 0xff800000;
          auVar236._16_4_ = 0xff800000;
          auVar236._20_4_ = 0xff800000;
          auVar236._24_4_ = 0xff800000;
          auVar236._28_4_ = 0xff800000;
          auVar121._8_4_ = 0x7f800000;
          auVar121._0_8_ = 0x7f8000007f800000;
          auVar121._12_4_ = 0x7f800000;
          auVar121._16_4_ = 0x7f800000;
          auVar121._20_4_ = 0x7f800000;
          auVar121._24_4_ = 0x7f800000;
          auVar121._28_4_ = 0x7f800000;
          auVar178 = vblendvps_avx(auVar121,auVar236,auVar203);
          auVar76 = vpackssdw_avx(auVar217._0_16_,auVar217._16_16_);
          auVar11 = vpmovsxwd_avx2(auVar76);
          auVar221 = vblendvps_avx(auVar221,auVar178,auVar11);
          auVar178 = vblendvps_avx(auVar236,auVar121,auVar203);
          auVar240 = vblendvps_avx(auVar240,auVar178,auVar11);
          auVar139._0_8_ = auVar217._0_8_ ^ 0xffffffffffffffff;
          auVar139._8_4_ = auVar217._8_4_ ^ 0xffffffff;
          auVar139._12_4_ = auVar217._12_4_ ^ 0xffffffff;
          auVar139._16_4_ = auVar217._16_4_ ^ 0xffffffff;
          auVar139._20_4_ = auVar217._20_4_ ^ 0xffffffff;
          auVar139._24_4_ = auVar217._24_4_ ^ 0xffffffff;
          auVar139._28_4_ = auVar217._28_4_ ^ 0xffffffff;
          auVar217 = vorps_avx(auVar203,auVar139);
          auVar217 = vandps_avx(auVar167,auVar217);
        }
      }
      auVar237 = ZEXT3264(auVar217);
      auVar258 = ZEXT3264(auVar254);
      local_4c0 = local_a40;
      local_4a0 = vminps_avx(local_460,auVar221);
      _local_820 = vmaxps_avx(local_a40,auVar240);
      _local_480 = _local_820;
      auVar178 = vcmpps_avx(local_a40,local_4a0,2);
      local_5c0 = vandps_avx(auVar178,auVar84);
      auVar178 = vcmpps_avx(_local_820,local_460,2);
      local_840 = vandps_avx(auVar178,auVar84);
      auVar242 = ZEXT3264(local_840);
      auVar84 = vorps_avx(local_840,local_5c0);
      if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar84 >> 0x7f,0) == '\0') &&
            (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0xbf,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f])
      {
        auVar206 = ZEXT3264(local_9e0);
      }
      else {
        auStack_8d8 = auVar24._8_24_;
        auVar47._4_4_ = (float)local_8a0._4_4_ * auVar191._4_4_;
        auVar47._0_4_ = (float)local_8a0._0_4_ * auVar191._0_4_;
        auVar47._8_4_ = fStack_898 * auVar191._8_4_;
        auVar47._12_4_ = fStack_894 * auVar191._12_4_;
        auVar47._16_4_ = fStack_890 * auVar191._16_4_;
        auVar47._20_4_ = fStack_88c * auVar191._20_4_;
        auVar47._24_4_ = fStack_888 * auVar191._24_4_;
        auVar47._28_4_ = auVar84._28_4_;
        auVar76 = vfmadd213ps_fma(auVar205,_local_640,auVar47);
        auVar76 = vfmadd213ps_fma(auVar164,_local_660,ZEXT1632(auVar76));
        auVar87._0_8_ = auVar217._0_8_ ^ 0xffffffffffffffff;
        auVar87._8_4_ = auVar217._8_4_ ^ 0xffffffff;
        auVar87._12_4_ = auVar217._12_4_ ^ 0xffffffff;
        auVar87._16_4_ = auVar217._16_4_ ^ 0xffffffff;
        auVar87._20_4_ = auVar217._20_4_ ^ 0xffffffff;
        auVar87._24_4_ = auVar217._24_4_ ^ 0xffffffff;
        auVar87._28_4_ = auVar217._28_4_ ^ 0xffffffff;
        auVar242 = ZEXT3264(local_680);
        auVar84 = vandps_avx(local_680,ZEXT1632(auVar76));
        auVar136._8_4_ = 0x3e99999a;
        auVar136._0_8_ = 0x3e99999a3e99999a;
        auVar136._12_4_ = 0x3e99999a;
        auVar136._16_4_ = 0x3e99999a;
        auVar136._20_4_ = 0x3e99999a;
        auVar136._24_4_ = 0x3e99999a;
        auVar136._28_4_ = 0x3e99999a;
        auVar84 = vcmpps_avx(auVar84,auVar136,1);
        local_600 = vorps_avx(auVar84,auVar87);
        auVar48._4_4_ = (float)local_8a0._4_4_ * (float)local_c00._4_4_;
        auVar48._0_4_ = (float)local_8a0._0_4_ * (float)local_c00._0_4_;
        auVar48._8_4_ = fStack_898 * fStack_bf8;
        auVar48._12_4_ = fStack_894 * fStack_bf4;
        auVar48._16_4_ = fStack_890 * fStack_bf0;
        auVar48._20_4_ = fStack_88c * fStack_bec;
        auVar48._24_4_ = fStack_888 * fStack_be8;
        auVar48._28_4_ = local_600._28_4_;
        auVar76 = vfmadd213ps_fma(auVar227,_local_640,auVar48);
        auVar76 = vfmadd213ps_fma(auVar181,_local_660,ZEXT1632(auVar76));
        auVar84 = vandps_avx(local_680,ZEXT1632(auVar76));
        auVar84 = vcmpps_avx(auVar84,auVar136,1);
        auVar84 = vorps_avx(auVar84,auVar87);
        auVar115._8_4_ = 3;
        auVar115._0_8_ = 0x300000003;
        auVar115._12_4_ = 3;
        auVar115._16_4_ = 3;
        auVar115._20_4_ = 3;
        auVar115._24_4_ = 3;
        auVar115._28_4_ = 3;
        auVar137._8_4_ = 2;
        auVar137._0_8_ = 0x200000002;
        auVar137._12_4_ = 2;
        auVar137._16_4_ = 2;
        auVar137._20_4_ = 2;
        auVar137._24_4_ = 2;
        auVar137._28_4_ = 2;
        auVar84 = vblendvps_avx(auVar137,auVar115,auVar84);
        local_620._4_4_ = local_c44;
        local_620._0_4_ = local_c44;
        local_620._8_4_ = local_c44;
        local_620._12_4_ = local_c44;
        local_620._16_4_ = local_c44;
        local_620._20_4_ = local_c44;
        local_620._24_4_ = local_c44;
        local_620._28_4_ = local_c44;
        _local_5e0 = vpcmpgtd_avx2(auVar84,local_620);
        auVar84 = vpandn_avx2(_local_5e0,local_5c0);
        local_860._4_4_ = local_a40._4_4_ + (float)local_8c0._4_4_;
        local_860._0_4_ = local_a40._0_4_ + (float)local_8c0._0_4_;
        fStack_858 = local_a40._8_4_ + fStack_8b8;
        fStack_854 = local_a40._12_4_ + fStack_8b4;
        fStack_850 = local_a40._16_4_ + fStack_8b0;
        fStack_84c = local_a40._20_4_ + fStack_8ac;
        fStack_848 = local_a40._24_4_ + fStack_8a8;
        fStack_844 = local_a40._28_4_ + fStack_8a4;
        while( true ) {
          local_4e0 = auVar84;
          fStack_b2c = auVar8._4_4_;
          fStack_b28 = auVar8._8_4_;
          fStack_b24 = auVar8._12_4_;
          if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar84 >> 0x7f,0) == '\0') &&
                (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar84 >> 0xbf,0) == '\0') &&
              (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar84[0x1f]) break;
          auVar116._8_4_ = 0x7f800000;
          auVar116._0_8_ = 0x7f8000007f800000;
          auVar116._12_4_ = 0x7f800000;
          auVar116._16_4_ = 0x7f800000;
          auVar116._20_4_ = 0x7f800000;
          auVar116._24_4_ = 0x7f800000;
          auVar116._28_4_ = 0x7f800000;
          auVar217 = vblendvps_avx(auVar116,local_a40,auVar84);
          auVar178 = vshufps_avx(auVar217,auVar217,0xb1);
          auVar178 = vminps_avx(auVar217,auVar178);
          auVar203 = vshufpd_avx(auVar178,auVar178,5);
          auVar178 = vminps_avx(auVar178,auVar203);
          auVar203 = vpermpd_avx2(auVar178,0x4e);
          auVar178 = vminps_avx(auVar178,auVar203);
          auVar217 = vcmpps_avx(auVar217,auVar178,0);
          auVar178 = auVar84 & auVar217;
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0x7f,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0xbf,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0x1f] < '\0') {
            auVar84 = vandps_avx(auVar217,auVar84);
          }
          uVar57 = vmovmskps_avx(auVar84);
          iVar12 = 0;
          for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
            iVar12 = iVar12 + 1;
          }
          uVar60 = iVar12 << 2;
          *(undefined4 *)(local_4e0 + uVar60) = 0;
          uVar57 = *(uint *)(local_1a0 + uVar60);
          uVar60 = *(uint *)(local_4c0 + uVar60);
          fVar129 = auVar5._0_4_;
          auVar84 = auVar258._0_32_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar242 = ZEXT1664(auVar242._0_16_);
            fVar129 = sqrtf((float)local_980._0_4_);
            auVar84 = auVar254;
          }
          auVar245 = ZEXT3264(auVar84);
          auVar79 = vminps_avx(auVar9,auVar69);
          auVar76 = vmaxps_avx(auVar9,auVar69);
          auVar96 = vminps_avx(auVar70,auVar8);
          auVar73 = vminps_avx(auVar79,auVar96);
          auVar79 = vmaxps_avx(auVar70,auVar8);
          auVar96 = vmaxps_avx(auVar76,auVar79);
          auVar76 = vandps_avx(auVar73,auVar224);
          auVar79 = vandps_avx(auVar96,auVar224);
          auVar76 = vmaxps_avx(auVar76,auVar79);
          auVar79 = vmovshdup_avx(auVar76);
          auVar79 = vmaxss_avx(auVar79,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar79);
          local_9a0._0_4_ = auVar76._0_4_ * 1.9073486e-06;
          local_9c0._0_4_ = fVar129 * 1.9073486e-06;
          local_800._0_16_ = vshufps_avx(auVar96,auVar96,0xff);
          auVar76 = vinsertps_avx(ZEXT416(uVar60),ZEXT416(uVar57),0x10);
          auVar232 = ZEXT1664(auVar76);
          lVar59 = 5;
          do {
            do {
              bVar65 = lVar59 == 0;
              lVar59 = lVar59 + -1;
              auVar217 = auVar245._0_32_;
              if (bVar65) goto LAB_01193dd6;
              auVar97 = auVar232._0_16_;
              local_a80._0_16_ = vmovshdup_avx(auVar97);
              fVar141 = 1.0 - local_a80._0_4_;
              auVar76 = vshufps_avx(auVar97,auVar97,0x55);
              fVar129 = auVar76._0_4_;
              auVar98._0_4_ = fVar91 * fVar129;
              fVar94 = auVar76._4_4_;
              auVar98._4_4_ = auVar69._4_4_ * fVar94;
              fVar140 = auVar76._8_4_;
              auVar98._8_4_ = auVar69._8_4_ * fVar140;
              fVar123 = auVar76._12_4_;
              auVar98._12_4_ = auVar69._12_4_ * fVar123;
              auVar130._4_4_ = fVar141;
              auVar130._0_4_ = fVar141;
              auVar130._8_4_ = fVar141;
              auVar130._12_4_ = fVar141;
              auVar76 = vfmadd231ps_fma(auVar98,auVar130,auVar9);
              auVar146._0_4_ = fVar92 * fVar129;
              auVar146._4_4_ = auVar70._4_4_ * fVar94;
              auVar146._8_4_ = auVar70._8_4_ * fVar140;
              auVar146._12_4_ = auVar70._12_4_ * fVar123;
              auVar79 = vfmadd231ps_fma(auVar146,auVar130,auVar69);
              auVar187._0_4_ = fVar129 * auVar79._0_4_;
              auVar187._4_4_ = fVar94 * auVar79._4_4_;
              auVar187._8_4_ = fVar140 * auVar79._8_4_;
              auVar187._12_4_ = fVar123 * auVar79._12_4_;
              auVar96 = vfmadd231ps_fma(auVar187,auVar130,auVar76);
              auVar99._0_4_ = fVar129 * fVar93;
              auVar99._4_4_ = fVar94 * fStack_b2c;
              auVar99._8_4_ = fVar140 * fStack_b28;
              auVar99._12_4_ = fVar123 * fStack_b24;
              auVar76 = vfmadd231ps_fma(auVar99,auVar130,auVar70);
              auVar172._0_4_ = fVar129 * auVar76._0_4_;
              auVar172._4_4_ = fVar94 * auVar76._4_4_;
              auVar172._8_4_ = fVar140 * auVar76._8_4_;
              auVar172._12_4_ = fVar123 * auVar76._12_4_;
              auVar79 = vfmadd231ps_fma(auVar172,auVar130,auVar79);
              uVar63 = auVar232._0_4_;
              auVar100._4_4_ = uVar63;
              auVar100._0_4_ = uVar63;
              auVar100._8_4_ = uVar63;
              auVar100._12_4_ = uVar63;
              auVar76 = vfmadd213ps_fma(auVar100,local_970,_DAT_01f45a50);
              auVar72._0_4_ = fVar129 * auVar79._0_4_;
              auVar72._4_4_ = fVar94 * auVar79._4_4_;
              auVar72._8_4_ = fVar140 * auVar79._8_4_;
              auVar72._12_4_ = fVar123 * auVar79._12_4_;
              auVar73 = vfmadd231ps_fma(auVar72,auVar96,auVar130);
              local_780._0_16_ = auVar73;
              auVar76 = vsubps_avx(auVar76,auVar73);
              _local_940 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              fVar129 = auVar76._0_4_;
              if (fVar129 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar141);
                local_a00._0_16_ = auVar79;
                auVar90._0_4_ = sqrtf(fVar129);
                auVar90._4_60_ = extraout_var;
                auVar232 = ZEXT1664(auVar97);
                auVar73 = auVar90._0_16_;
                auVar79 = local_a00._0_16_;
                auVar145 = local_aa0._0_16_;
              }
              else {
                auVar73 = vsqrtss_avx(auVar76,auVar76);
                auVar145 = ZEXT416((uint)fVar141);
              }
              auVar79 = vsubps_avx(auVar79,auVar96);
              auVar215._0_4_ = auVar79._0_4_ * 3.0;
              auVar215._4_4_ = auVar79._4_4_ * 3.0;
              auVar215._8_4_ = auVar79._8_4_ * 3.0;
              auVar215._12_4_ = auVar79._12_4_ * 3.0;
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar145,local_a80._0_16_);
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar145);
              fVar94 = auVar145._0_4_ * 6.0;
              fVar140 = auVar79._0_4_ * 6.0;
              fVar123 = auVar96._0_4_ * 6.0;
              fVar141 = local_a80._0_4_ * 6.0;
              auVar147._0_4_ = fVar141 * fVar93;
              auVar147._4_4_ = fVar141 * fStack_b2c;
              auVar147._8_4_ = fVar141 * fStack_b28;
              auVar147._12_4_ = fVar141 * fStack_b24;
              auVar101._4_4_ = fVar123;
              auVar101._0_4_ = fVar123;
              auVar101._8_4_ = fVar123;
              auVar101._12_4_ = fVar123;
              auVar79 = vfmadd132ps_fma(auVar101,auVar147,auVar70);
              auVar148._4_4_ = fVar140;
              auVar148._0_4_ = fVar140;
              auVar148._8_4_ = fVar140;
              auVar148._12_4_ = fVar140;
              auVar79 = vfmadd132ps_fma(auVar148,auVar79,auVar69);
              auVar96 = vdpps_avx(auVar215,auVar215,0x7f);
              auVar102._4_4_ = fVar94;
              auVar102._0_4_ = fVar94;
              auVar102._8_4_ = fVar94;
              auVar102._12_4_ = fVar94;
              auVar171 = vfmadd132ps_fma(auVar102,auVar79,auVar9);
              auVar79 = vblendps_avx(auVar96,_DAT_01f45a50,0xe);
              auVar145 = vrsqrtss_avx(auVar79,auVar79);
              fVar123 = auVar96._0_4_;
              fVar94 = auVar145._0_4_;
              auVar145 = vdpps_avx(auVar215,auVar171,0x7f);
              fVar94 = fVar94 * 1.5 + fVar123 * -0.5 * fVar94 * fVar94 * fVar94;
              auVar103._0_4_ = auVar171._0_4_ * fVar123;
              auVar103._4_4_ = auVar171._4_4_ * fVar123;
              auVar103._8_4_ = auVar171._8_4_ * fVar123;
              auVar103._12_4_ = auVar171._12_4_ * fVar123;
              fVar140 = auVar145._0_4_;
              auVar188._0_4_ = auVar215._0_4_ * fVar140;
              auVar188._4_4_ = auVar215._4_4_ * fVar140;
              auVar188._8_4_ = auVar215._8_4_ * fVar140;
              auVar188._12_4_ = auVar215._12_4_ * fVar140;
              auVar145 = vsubps_avx(auVar103,auVar188);
              auVar79 = vrcpss_avx(auVar79,auVar79);
              auVar171 = vfnmadd213ss_fma(auVar79,auVar96,ZEXT416(0x40000000));
              fVar140 = auVar79._0_4_ * auVar171._0_4_;
              auVar79 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                   ZEXT416((uint)(auVar232._0_4_ * (float)local_9c0._0_4_)));
              auVar258 = ZEXT1664(auVar79);
              uVar62 = CONCAT44(auVar215._4_4_,auVar215._0_4_);
              auVar253._0_8_ = uVar62 ^ 0x8000000080000000;
              auVar253._8_4_ = -auVar215._8_4_;
              auVar253._12_4_ = -auVar215._12_4_;
              auVar149._0_4_ = fVar94 * auVar145._0_4_ * fVar140;
              auVar149._4_4_ = fVar94 * auVar145._4_4_ * fVar140;
              auVar149._8_4_ = fVar94 * auVar145._8_4_ * fVar140;
              auVar149._12_4_ = fVar94 * auVar145._12_4_ * fVar140;
              auVar200._0_4_ = auVar215._0_4_ * fVar94;
              auVar200._4_4_ = auVar215._4_4_ * fVar94;
              auVar200._8_4_ = auVar215._8_4_ * fVar94;
              auVar200._12_4_ = auVar215._12_4_ * fVar94;
              local_a80._0_16_ = auVar215;
              local_aa0._0_4_ = auVar79._0_4_;
              if (fVar123 < -fVar123) {
                local_a00._0_16_ = auVar253;
                local_a20._0_16_ = auVar200;
                local_ac0._0_16_ = auVar149;
                fVar94 = sqrtf(fVar123);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar258 = ZEXT464((uint)local_aa0._0_4_);
                auVar149 = local_ac0._0_16_;
                auVar200 = local_a20._0_16_;
                auVar253 = local_a00._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar96,auVar96);
                fVar94 = auVar79._0_4_;
              }
              auVar79 = vdpps_avx(_local_940,auVar200,0x7f);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar73,auVar258._0_16_);
              auVar96 = vdpps_avx(auVar253,auVar200,0x7f);
              auVar145 = vdpps_avx(_local_940,auVar149,0x7f);
              auVar171 = vdpps_avx(local_970,auVar200,0x7f);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(auVar73._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_9a0._0_4_ / fVar94)),auVar68);
              auVar237 = ZEXT1664(auVar68);
              fVar94 = auVar96._0_4_ + auVar145._0_4_;
              auVar74._0_4_ = auVar79._0_4_ * auVar79._0_4_;
              auVar74._4_4_ = auVar79._4_4_ * auVar79._4_4_;
              auVar74._8_4_ = auVar79._8_4_ * auVar79._8_4_;
              auVar74._12_4_ = auVar79._12_4_ * auVar79._12_4_;
              auVar96 = vdpps_avx(_local_940,auVar253,0x7f);
              auVar145 = vsubps_avx(auVar76,auVar74);
              auVar73 = vrsqrtss_avx(auVar145,auVar145);
              fVar123 = auVar145._0_4_;
              fVar140 = auVar73._0_4_;
              fVar140 = fVar140 * 1.5 + fVar123 * -0.5 * fVar140 * fVar140 * fVar140;
              auVar73 = vdpps_avx(_local_940,local_970,0x7f);
              auVar96 = vfnmadd231ss_fma(auVar96,auVar79,ZEXT416((uint)fVar94));
              auVar73 = vfnmadd231ss_fma(auVar73,auVar79,auVar171);
              if (fVar123 < 0.0) {
                local_a00._0_16_ = auVar79;
                local_a20._0_4_ = auVar68._0_4_;
                local_ac0._0_16_ = ZEXT416((uint)fVar94);
                local_7a0._0_16_ = auVar171;
                local_7c0._0_4_ = fVar140;
                local_7e0._0_16_ = auVar73;
                fVar123 = sqrtf(fVar123);
                auVar237 = ZEXT464((uint)local_a20._0_4_);
                auVar258 = ZEXT464((uint)local_aa0._0_4_);
                fVar140 = (float)local_7c0._0_4_;
                auVar73 = local_7e0._0_16_;
                auVar171 = local_7a0._0_16_;
                auVar79 = local_a00._0_16_;
                auVar145 = local_ac0._0_16_;
              }
              else {
                auVar145 = vsqrtss_avx(auVar145,auVar145);
                fVar123 = auVar145._0_4_;
                auVar145 = ZEXT416((uint)fVar94);
              }
              auVar242 = ZEXT1664(auVar79);
              auVar245 = ZEXT3264(auVar254);
              auVar68 = vpermilps_avx(local_780._0_16_,0xff);
              fVar123 = fVar123 - auVar68._0_4_;
              auVar68 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xff);
              auVar96 = vfmsub213ss_fma(auVar96,ZEXT416((uint)fVar140),auVar68);
              auVar150._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
              auVar150._8_4_ = auVar171._8_4_ ^ 0x80000000;
              auVar150._12_4_ = auVar171._12_4_ ^ 0x80000000;
              auVar173._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
              auVar173._8_4_ = auVar96._8_4_ ^ 0x80000000;
              auVar173._12_4_ = auVar96._12_4_ ^ 0x80000000;
              auVar95 = ZEXT416((uint)(auVar73._0_4_ * fVar140));
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar96._0_4_ * auVar171._0_4_)),auVar145,
                                        auVar95);
              auVar96 = vinsertps_avx(auVar173,auVar95,0x1c);
              uVar63 = auVar73._0_4_;
              auVar174._4_4_ = uVar63;
              auVar174._0_4_ = uVar63;
              auVar174._8_4_ = uVar63;
              auVar174._12_4_ = uVar63;
              auVar96 = vdivps_avx(auVar96,auVar174);
              auVar73 = vinsertps_avx(auVar145,auVar150,0x10);
              auVar73 = vdivps_avx(auVar73,auVar174);
              fVar94 = auVar79._0_4_;
              auVar131._0_4_ = fVar94 * auVar96._0_4_ + fVar123 * auVar73._0_4_;
              auVar131._4_4_ = fVar94 * auVar96._4_4_ + fVar123 * auVar73._4_4_;
              auVar131._8_4_ = fVar94 * auVar96._8_4_ + fVar123 * auVar73._8_4_;
              auVar131._12_4_ = fVar94 * auVar96._12_4_ + fVar123 * auVar73._12_4_;
              auVar73 = vsubps_avx(auVar97,auVar131);
              auVar232 = ZEXT1664(auVar73);
              auVar96 = vandps_avx(auVar79,auVar224);
            } while (auVar237._0_4_ <= auVar96._0_4_);
            auVar97 = vfmadd231ss_fma(ZEXT416((uint)(auVar258._0_4_ + auVar237._0_4_)),
                                      local_800._0_16_,ZEXT416(0x36000000));
            auVar96 = vandps_avx(ZEXT416((uint)fVar123),auVar224);
          } while (auVar97._0_4_ <= auVar96._0_4_);
          fVar94 = auVar73._0_4_ + (float)local_910._0_4_;
          auVar96 = ZEXT416((uint)fVar94);
          auVar217 = auVar254;
          if ((fVar66 <= fVar94) && (fVar140 = *(float *)(ray + k * 4 + 0x80), fVar94 <= fVar140)) {
            auVar97 = vmovshdup_avx(auVar73);
            fVar123 = auVar97._0_4_;
            if ((0.0 <= fVar123) && (fVar123 <= 1.0)) {
              auVar76 = vrsqrtss_avx(auVar76,auVar76);
              fVar141 = auVar76._0_4_;
              pGVar3 = (context->scene->geometries).items[uVar58].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar129 = fVar141 * 1.5 + fVar129 * -0.5 * fVar141 * fVar141 * fVar141;
                auVar151._0_4_ = fVar129 * (float)local_940._0_4_;
                auVar151._4_4_ = fVar129 * (float)local_940._4_4_;
                auVar151._8_4_ = fVar129 * fStack_938;
                auVar151._12_4_ = fVar129 * fStack_934;
                auVar171 = vfmadd213ps_fma(auVar68,auVar151,local_a80._0_16_);
                auVar76 = vshufps_avx(auVar151,auVar151,0xc9);
                auVar97 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xc9);
                auVar152._0_4_ = auVar151._0_4_ * auVar97._0_4_;
                auVar152._4_4_ = auVar151._4_4_ * auVar97._4_4_;
                auVar152._8_4_ = auVar151._8_4_ * auVar97._8_4_;
                auVar152._12_4_ = auVar151._12_4_ * auVar97._12_4_;
                auVar145 = vfmsub231ps_fma(auVar152,local_a80._0_16_,auVar76);
                auVar76 = vshufps_avx(auVar145,auVar145,0xc9);
                auVar97 = vshufps_avx(auVar171,auVar171,0xc9);
                auVar145 = vshufps_avx(auVar145,auVar145,0xd2);
                auVar75._0_4_ = auVar171._0_4_ * auVar145._0_4_;
                auVar75._4_4_ = auVar171._4_4_ * auVar145._4_4_;
                auVar75._8_4_ = auVar171._8_4_ * auVar145._8_4_;
                auVar75._12_4_ = auVar171._12_4_ * auVar145._12_4_;
                auVar76 = vfmsub231ps_fma(auVar75,auVar76,auVar97);
                uVar63 = auVar76._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar94;
                  uVar2 = vextractps_avx(auVar76,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                  uVar2 = vextractps_avx(auVar76,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar63;
                  *(float *)(ray + k * 4 + 0xf0) = fVar123;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                  *(uint *)(ray + k * 4 + 0x120) = uVar58;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_710 = vshufps_avx(auVar73,auVar73,0x55);
                  auVar73 = vshufps_avx(auVar76,auVar76,0x55);
                  auStack_730 = vshufps_avx(auVar76,auVar76,0xaa);
                  local_740 = (RTCHitN  [16])auVar73;
                  local_720 = uVar63;
                  uStack_71c = uVar63;
                  uStack_718 = uVar63;
                  uStack_714 = uVar63;
                  local_700 = ZEXT416(0) << 0x20;
                  local_6f0 = CONCAT44(uStack_75c,local_760);
                  uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                  local_6e0._4_4_ = uStack_74c;
                  local_6e0._0_4_ = local_750;
                  local_6e0._8_4_ = uStack_748;
                  local_6e0._12_4_ = uStack_744;
                  vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                  uStack_6cc = context->user->instID[0];
                  local_6d0 = uStack_6cc;
                  uStack_6c8 = uStack_6cc;
                  uStack_6c4 = uStack_6cc;
                  uStack_6c0 = context->user->instPrimID[0];
                  uStack_6bc = uStack_6c0;
                  uStack_6b8 = uStack_6c0;
                  uStack_6b4 = uStack_6c0;
                  *(float *)(ray + k * 4 + 0x80) = fVar94;
                  local_880._0_16_ = *local_a48;
                  local_af0.valid = (int *)local_880;
                  local_af0.geometryUserPtr = pGVar3->userPtr;
                  local_af0.context = context->user;
                  local_af0.hit = local_740;
                  local_af0.N = 4;
                  auVar76 = *local_a48;
                  local_af0.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar237 = ZEXT1664(auVar237._0_16_);
                    auVar242 = ZEXT1664(auVar79);
                    (*pGVar3->intersectionFilterN)(&local_af0);
                    auVar122._8_56_ = extraout_var_01;
                    auVar122._0_8_ = extraout_XMM1_Qa;
                    auVar96 = auVar122._0_16_;
                    auVar76 = local_880._0_16_;
                  }
                  if (auVar76 == (undefined1  [16])0x0) {
                    auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar76 = vpcmpeqd_avx(auVar96,auVar96);
                    auVar79 = auVar79 ^ auVar76;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    auVar96 = vpcmpeqd_avx(auVar73,auVar73);
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar237 = ZEXT1664(auVar237._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      (*p_Var4)(&local_af0);
                      auVar96 = vpcmpeqd_avx(auVar96,auVar96);
                      auVar76 = local_880._0_16_;
                    }
                    auVar73 = vpcmpeqd_avx(auVar76,_DAT_01f45a50);
                    auVar79 = auVar73 ^ auVar96;
                    if (auVar76 != (undefined1  [16])0x0) {
                      auVar73 = auVar73 ^ auVar96;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])local_af0.hit);
                      *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar76;
                      auVar76 = vmaskmovps_avx(auVar73,*(undefined1 (*) [16])(local_af0.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar76;
                    }
                  }
                  auVar77._8_8_ = 0x100000001;
                  auVar77._0_8_ = 0x100000001;
                  if ((auVar77 & auVar79) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar140;
                  }
                }
              }
            }
          }
LAB_01193dd6:
          uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar230._4_4_ = uVar63;
          auVar230._0_4_ = uVar63;
          auVar230._8_4_ = uVar63;
          auVar230._12_4_ = uVar63;
          auVar230._16_4_ = uVar63;
          auVar230._20_4_ = uVar63;
          auVar230._24_4_ = uVar63;
          auVar230._28_4_ = uVar63;
          auVar232 = ZEXT3264(auVar230);
          auVar84 = vcmpps_avx(_local_860,auVar230,2);
          auVar84 = vandps_avx(auVar84,local_4e0);
          auVar258 = ZEXT3264(auVar217);
        }
        auVar88._0_4_ = (float)local_8c0._0_4_ + (float)local_820._0_4_;
        auVar88._4_4_ = (float)local_8c0._4_4_ + (float)local_820._4_4_;
        auVar88._8_4_ = fStack_8b8 + fStack_818;
        auVar88._12_4_ = fStack_8b4 + fStack_814;
        auVar88._16_4_ = fStack_8b0 + fStack_810;
        auVar88._20_4_ = fStack_8ac + fStack_80c;
        auVar88._24_4_ = fStack_8a8 + fStack_808;
        auVar88._28_4_ = fStack_8a4 + fStack_804;
        uVar63 = auVar232._0_4_;
        auVar117._4_4_ = uVar63;
        auVar117._0_4_ = uVar63;
        auVar117._8_4_ = uVar63;
        auVar117._12_4_ = uVar63;
        auVar117._16_4_ = uVar63;
        auVar117._20_4_ = uVar63;
        auVar117._24_4_ = uVar63;
        auVar117._28_4_ = uVar63;
        auVar84 = vcmpps_avx(auVar88,auVar117,2);
        local_840 = vandps_avx(auVar84,local_840);
        auVar89._8_4_ = 3;
        auVar89._0_8_ = 0x300000003;
        auVar89._12_4_ = 3;
        auVar89._16_4_ = 3;
        auVar89._20_4_ = 3;
        auVar89._24_4_ = 3;
        auVar89._28_4_ = 3;
        auVar118._8_4_ = 2;
        auVar118._0_8_ = 0x200000002;
        auVar118._12_4_ = 2;
        auVar118._16_4_ = 2;
        auVar118._20_4_ = 2;
        auVar118._24_4_ = 2;
        auVar118._28_4_ = 2;
        auVar84 = vblendvps_avx(auVar118,auVar89,local_600);
        _local_860 = vpcmpgtd_avx2(auVar84,local_620);
        local_880 = vpandn_avx2(_local_860,local_840);
        local_a40 = _local_480;
        local_820._4_4_ = (float)local_8c0._4_4_ + (float)local_480._4_4_;
        local_820._0_4_ = (float)local_8c0._0_4_ + (float)local_480._0_4_;
        fStack_818 = fStack_8b8 + fStack_478;
        fStack_814 = fStack_8b4 + fStack_474;
        fStack_810 = fStack_8b0 + fStack_470;
        fStack_80c = fStack_8ac + fStack_46c;
        fStack_808 = fStack_8a8 + fStack_468;
        fStack_804 = fStack_8a4 + fStack_464;
        auVar206 = ZEXT3264(local_9e0);
        for (; (((((((local_880 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_880 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_880 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_880 >> 0x7f,0) != '\0') ||
                 (local_880 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_880 >> 0xbf,0) != '\0') ||
               (local_880 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_880[0x1f] < '\0'; local_880 = vandps_avx(auVar84,local_880)) {
          auVar119._8_4_ = 0x7f800000;
          auVar119._0_8_ = 0x7f8000007f800000;
          auVar119._12_4_ = 0x7f800000;
          auVar119._16_4_ = 0x7f800000;
          auVar119._20_4_ = 0x7f800000;
          auVar119._24_4_ = 0x7f800000;
          auVar119._28_4_ = 0x7f800000;
          auVar84 = vblendvps_avx(auVar119,local_a40,local_880);
          auVar217 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar217 = vminps_avx(auVar84,auVar217);
          auVar178 = vshufpd_avx(auVar217,auVar217,5);
          auVar217 = vminps_avx(auVar217,auVar178);
          auVar178 = vpermpd_avx2(auVar217,0x4e);
          auVar217 = vminps_avx(auVar217,auVar178);
          auVar217 = vcmpps_avx(auVar84,auVar217,0);
          auVar178 = local_880 & auVar217;
          auVar84 = local_880;
          if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar178 >> 0x7f,0) != '\0') ||
                (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar178 >> 0xbf,0) != '\0') ||
              (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0x1f] < '\0') {
            auVar84 = vandps_avx(auVar217,local_880);
          }
          uVar57 = vmovmskps_avx(auVar84);
          iVar12 = 0;
          for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000) {
            iVar12 = iVar12 + 1;
          }
          uVar60 = iVar12 << 2;
          *(undefined4 *)(local_880 + uVar60) = 0;
          uVar57 = *(uint *)(local_1c0 + uVar60);
          uVar60 = *(uint *)(local_460 + uVar60);
          fVar129 = auVar7._0_4_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar237 = ZEXT1664(auVar237._0_16_);
            auVar242 = ZEXT1664(auVar242._0_16_);
            fVar129 = sqrtf((float)local_980._0_4_);
            auVar258 = ZEXT3264(auVar254);
            auVar206 = ZEXT3264(local_9e0);
          }
          auVar79 = vminps_avx(auVar9,auVar69);
          auVar76 = vmaxps_avx(auVar9,auVar69);
          auVar96 = vminps_avx(auVar70,auVar8);
          auVar73 = vminps_avx(auVar79,auVar96);
          auVar79 = vmaxps_avx(auVar70,auVar8);
          auVar96 = vmaxps_avx(auVar76,auVar79);
          auVar76 = vandps_avx(auVar73,auVar224);
          auVar79 = vandps_avx(auVar96,auVar224);
          auVar76 = vmaxps_avx(auVar76,auVar79);
          auVar79 = vmovshdup_avx(auVar76);
          auVar79 = vmaxss_avx(auVar79,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar79);
          local_9a0._0_4_ = auVar76._0_4_ * 1.9073486e-06;
          local_a00._0_4_ = fVar129 * 1.9073486e-06;
          local_800._0_16_ = vshufps_avx(auVar96,auVar96,0xff);
          auVar76 = vinsertps_avx(ZEXT416(uVar60),ZEXT416(uVar57),0x10);
          auVar232 = ZEXT1664(auVar76);
          lVar59 = 5;
          do {
            do {
              bVar65 = lVar59 == 0;
              lVar59 = lVar59 + -1;
              if (bVar65) goto LAB_011948bf;
              auVar73 = auVar232._0_16_;
              local_a80._0_16_ = vmovshdup_avx(auVar73);
              fVar141 = 1.0 - local_a80._0_4_;
              auVar76 = vshufps_avx(auVar73,auVar73,0x55);
              fVar129 = auVar76._0_4_;
              auVar104._0_4_ = fVar91 * fVar129;
              fVar94 = auVar76._4_4_;
              auVar104._4_4_ = auVar69._4_4_ * fVar94;
              fVar140 = auVar76._8_4_;
              auVar104._8_4_ = auVar69._8_4_ * fVar140;
              fVar123 = auVar76._12_4_;
              auVar104._12_4_ = auVar69._12_4_ * fVar123;
              auVar132._4_4_ = fVar141;
              auVar132._0_4_ = fVar141;
              auVar132._8_4_ = fVar141;
              auVar132._12_4_ = fVar141;
              auVar76 = vfmadd231ps_fma(auVar104,auVar132,auVar9);
              auVar153._0_4_ = fVar92 * fVar129;
              auVar153._4_4_ = auVar70._4_4_ * fVar94;
              auVar153._8_4_ = auVar70._8_4_ * fVar140;
              auVar153._12_4_ = auVar70._12_4_ * fVar123;
              auVar79 = vfmadd231ps_fma(auVar153,auVar132,auVar69);
              auVar189._0_4_ = fVar129 * auVar79._0_4_;
              auVar189._4_4_ = fVar94 * auVar79._4_4_;
              auVar189._8_4_ = fVar140 * auVar79._8_4_;
              auVar189._12_4_ = fVar123 * auVar79._12_4_;
              auVar96 = vfmadd231ps_fma(auVar189,auVar132,auVar76);
              auVar105._0_4_ = fVar129 * fVar93;
              auVar105._4_4_ = fVar94 * fStack_b2c;
              auVar105._8_4_ = fVar140 * fStack_b28;
              auVar105._12_4_ = fVar123 * fStack_b24;
              auVar76 = vfmadd231ps_fma(auVar105,auVar132,auVar70);
              auVar175._0_4_ = fVar129 * auVar76._0_4_;
              auVar175._4_4_ = fVar94 * auVar76._4_4_;
              auVar175._8_4_ = fVar140 * auVar76._8_4_;
              auVar175._12_4_ = fVar123 * auVar76._12_4_;
              local_9c0._0_16_ = vfmadd231ps_fma(auVar175,auVar132,auVar79);
              uVar63 = auVar232._0_4_;
              auVar106._4_4_ = uVar63;
              auVar106._0_4_ = uVar63;
              auVar106._8_4_ = uVar63;
              auVar106._12_4_ = uVar63;
              auVar76 = vfmadd213ps_fma(auVar106,local_970,_DAT_01f45a50);
              auVar78._0_4_ = fVar129 * local_9c0._0_4_;
              auVar78._4_4_ = fVar94 * local_9c0._4_4_;
              auVar78._8_4_ = fVar140 * local_9c0._8_4_;
              auVar78._12_4_ = fVar123 * local_9c0._12_4_;
              auVar79 = vfmadd231ps_fma(auVar78,auVar96,auVar132);
              local_780._0_16_ = auVar79;
              auVar76 = vsubps_avx(auVar76,auVar79);
              _local_940 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              fVar129 = auVar76._0_4_;
              if (fVar129 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar141);
                auVar245._0_4_ = sqrtf(fVar129);
                auVar245._4_60_ = extraout_var_00;
                auVar232 = ZEXT1664(auVar73);
                auVar79 = auVar245._0_16_;
                auVar97 = local_aa0._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar76,auVar76);
                auVar97 = ZEXT416((uint)fVar141);
              }
              auVar96 = vsubps_avx(local_9c0._0_16_,auVar96);
              auVar201._0_4_ = auVar96._0_4_ * 3.0;
              auVar201._4_4_ = auVar96._4_4_ * 3.0;
              auVar201._8_4_ = auVar96._8_4_ * 3.0;
              auVar201._12_4_ = auVar96._12_4_ * 3.0;
              auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar97,local_a80._0_16_);
              auVar145 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar97);
              fVar94 = auVar97._0_4_ * 6.0;
              fVar140 = auVar96._0_4_ * 6.0;
              fVar123 = auVar145._0_4_ * 6.0;
              fVar141 = local_a80._0_4_ * 6.0;
              auVar154._0_4_ = fVar141 * fVar93;
              auVar154._4_4_ = fVar141 * fStack_b2c;
              auVar154._8_4_ = fVar141 * fStack_b28;
              auVar154._12_4_ = fVar141 * fStack_b24;
              auVar107._4_4_ = fVar123;
              auVar107._0_4_ = fVar123;
              auVar107._8_4_ = fVar123;
              auVar107._12_4_ = fVar123;
              auVar96 = vfmadd132ps_fma(auVar107,auVar154,auVar70);
              auVar155._4_4_ = fVar140;
              auVar155._0_4_ = fVar140;
              auVar155._8_4_ = fVar140;
              auVar155._12_4_ = fVar140;
              auVar96 = vfmadd132ps_fma(auVar155,auVar96,auVar69);
              auVar97 = vdpps_avx(auVar201,auVar201,0x7f);
              auVar108._4_4_ = fVar94;
              auVar108._0_4_ = fVar94;
              auVar108._8_4_ = fVar94;
              auVar108._12_4_ = fVar94;
              auVar171 = vfmadd132ps_fma(auVar108,auVar96,auVar9);
              auVar96 = vblendps_avx(auVar97,_DAT_01f45a50,0xe);
              auVar145 = vrsqrtss_avx(auVar96,auVar96);
              fVar123 = auVar97._0_4_;
              fVar94 = auVar145._0_4_;
              auVar145 = vdpps_avx(auVar201,auVar171,0x7f);
              fVar94 = fVar94 * 1.5 + fVar123 * -0.5 * fVar94 * fVar94 * fVar94;
              auVar109._0_4_ = auVar171._0_4_ * fVar123;
              auVar109._4_4_ = auVar171._4_4_ * fVar123;
              auVar109._8_4_ = auVar171._8_4_ * fVar123;
              auVar109._12_4_ = auVar171._12_4_ * fVar123;
              fVar140 = auVar145._0_4_;
              auVar190._0_4_ = auVar201._0_4_ * fVar140;
              auVar190._4_4_ = auVar201._4_4_ * fVar140;
              auVar190._8_4_ = auVar201._8_4_ * fVar140;
              auVar190._12_4_ = auVar201._12_4_ * fVar140;
              auVar145 = vsubps_avx(auVar109,auVar190);
              auVar96 = vrcpss_avx(auVar96,auVar96);
              auVar171 = vfnmadd213ss_fma(auVar96,auVar97,ZEXT416(0x40000000));
              fVar140 = auVar96._0_4_ * auVar171._0_4_;
              auVar96 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                   ZEXT416((uint)(auVar232._0_4_ * (float)local_a00._0_4_)));
              auVar242 = ZEXT1664(auVar96);
              uVar62 = CONCAT44(auVar201._4_4_,auVar201._0_4_);
              local_9c0._0_8_ = uVar62 ^ 0x8000000080000000;
              local_9c0._8_4_ = -auVar201._8_4_;
              local_9c0._12_4_ = -auVar201._12_4_;
              auVar156._0_4_ = fVar94 * auVar145._0_4_ * fVar140;
              auVar156._4_4_ = fVar94 * auVar145._4_4_ * fVar140;
              auVar156._8_4_ = fVar94 * auVar145._8_4_ * fVar140;
              auVar156._12_4_ = fVar94 * auVar145._12_4_ * fVar140;
              auVar216._0_4_ = auVar201._0_4_ * fVar94;
              auVar216._4_4_ = auVar201._4_4_ * fVar94;
              auVar216._8_4_ = auVar201._8_4_ * fVar94;
              auVar216._12_4_ = auVar201._12_4_ * fVar94;
              local_a80._0_16_ = auVar201;
              local_aa0._0_4_ = auVar96._0_4_;
              if (fVar123 < -fVar123) {
                local_a20._0_16_ = auVar216;
                local_ac0._0_16_ = auVar156;
                fVar94 = sqrtf(fVar123);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar242 = ZEXT464((uint)local_aa0._0_4_);
                auVar156 = local_ac0._0_16_;
                auVar216 = local_a20._0_16_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar97,auVar97);
                fVar94 = auVar96._0_4_;
              }
              auVar96 = vdpps_avx(_local_940,auVar216,0x7f);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar79,auVar242._0_16_);
              auVar97 = vdpps_avx(local_9c0._0_16_,auVar216,0x7f);
              auVar145 = vdpps_avx(_local_940,auVar156,0x7f);
              auVar171 = vdpps_avx(local_970,auVar216,0x7f);
              auVar170 = vfmadd213ss_fma(ZEXT416((uint)(auVar79._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_9a0._0_4_ / fVar94)),auVar68);
              auVar80._0_4_ = auVar96._0_4_ * auVar96._0_4_;
              auVar80._4_4_ = auVar96._4_4_ * auVar96._4_4_;
              auVar80._8_4_ = auVar96._8_4_ * auVar96._8_4_;
              auVar80._12_4_ = auVar96._12_4_ * auVar96._12_4_;
              auVar79 = vdpps_avx(_local_940,local_9c0._0_16_,0x7f);
              auVar95 = vsubps_avx(auVar76,auVar80);
              auVar68 = vrsqrtss_avx(auVar95,auVar95);
              fVar140 = auVar95._0_4_;
              fVar94 = auVar68._0_4_;
              fVar94 = fVar94 * 1.5 + fVar140 * -0.5 * fVar94 * fVar94 * fVar94;
              auVar68 = vdpps_avx(_local_940,local_970,0x7f);
              local_9c0._0_16_ = ZEXT416((uint)(auVar97._0_4_ + auVar145._0_4_));
              auVar79 = vfnmadd231ss_fma(auVar79,auVar96,local_9c0._0_16_);
              auVar97 = vfnmadd231ss_fma(auVar68,auVar96,auVar171);
              if (fVar140 < 0.0) {
                local_a20._0_16_ = auVar96;
                local_ac0._0_16_ = auVar171;
                local_7a0._0_16_ = auVar79;
                local_7c0._0_4_ = fVar94;
                local_7e0._0_16_ = auVar97;
                fVar140 = sqrtf(fVar140);
                auVar242 = ZEXT464((uint)local_aa0._0_4_);
                fVar94 = (float)local_7c0._0_4_;
                auVar97 = local_7e0._0_16_;
                auVar171 = local_ac0._0_16_;
                auVar79 = local_7a0._0_16_;
                auVar96 = local_a20._0_16_;
              }
              else {
                auVar145 = vsqrtss_avx(auVar95,auVar95);
                fVar140 = auVar145._0_4_;
              }
              auVar237 = ZEXT1664(auVar76);
              auVar206 = ZEXT3264(local_9e0);
              auVar258 = ZEXT3264(auVar254);
              auVar145 = vpermilps_avx(local_780._0_16_,0xff);
              fVar140 = fVar140 - auVar145._0_4_;
              auVar145 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xff);
              auVar79 = vfmsub213ss_fma(auVar79,ZEXT416((uint)fVar94),auVar145);
              auVar157._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
              auVar157._8_4_ = auVar171._8_4_ ^ 0x80000000;
              auVar157._12_4_ = auVar171._12_4_ ^ 0x80000000;
              auVar176._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar176._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar176._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar68 = ZEXT416((uint)(auVar97._0_4_ * fVar94));
              auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar171._0_4_)),
                                        local_9c0._0_16_,auVar68);
              auVar79 = vinsertps_avx(auVar176,auVar68,0x1c);
              uVar63 = auVar97._0_4_;
              auVar177._4_4_ = uVar63;
              auVar177._0_4_ = uVar63;
              auVar177._8_4_ = uVar63;
              auVar177._12_4_ = uVar63;
              auVar79 = vdivps_avx(auVar79,auVar177);
              auVar97 = vinsertps_avx(local_9c0._0_16_,auVar157,0x10);
              auVar97 = vdivps_avx(auVar97,auVar177);
              fVar94 = auVar96._0_4_;
              auVar133._0_4_ = fVar94 * auVar79._0_4_ + fVar140 * auVar97._0_4_;
              auVar133._4_4_ = fVar94 * auVar79._4_4_ + fVar140 * auVar97._4_4_;
              auVar133._8_4_ = fVar94 * auVar79._8_4_ + fVar140 * auVar97._8_4_;
              auVar133._12_4_ = fVar94 * auVar79._12_4_ + fVar140 * auVar97._12_4_;
              auVar73 = vsubps_avx(auVar73,auVar133);
              auVar232 = ZEXT1664(auVar73);
              auVar79 = vandps_avx(auVar96,auVar224);
            } while (auVar170._0_4_ <= auVar79._0_4_);
            auVar96 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + auVar170._0_4_)),
                                      local_800._0_16_,ZEXT416(0x36000000));
            auVar79 = vandps_avx(ZEXT416((uint)fVar140),auVar224);
          } while (auVar96._0_4_ <= auVar79._0_4_);
          fVar94 = auVar73._0_4_ + (float)local_910._0_4_;
          auVar79 = ZEXT416((uint)fVar94);
          if (fVar66 <= fVar94) {
            fVar140 = *(float *)(ray + k * 4 + 0x80);
            auVar242 = ZEXT464((uint)fVar140);
            if (fVar94 <= fVar140) {
              auVar96 = vmovshdup_avx(auVar73);
              fVar123 = auVar96._0_4_;
              if ((0.0 <= fVar123) && (fVar123 <= 1.0)) {
                auVar96 = vrsqrtss_avx(auVar76,auVar76);
                fVar141 = auVar96._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar58].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar129 = fVar141 * 1.5 + fVar129 * -0.5 * fVar141 * fVar141 * fVar141;
                  auVar158._0_4_ = fVar129 * (float)local_940._0_4_;
                  auVar158._4_4_ = fVar129 * (float)local_940._4_4_;
                  auVar158._8_4_ = fVar129 * fStack_938;
                  auVar158._12_4_ = fVar129 * fStack_934;
                  auVar171 = vfmadd213ps_fma(auVar145,auVar158,local_a80._0_16_);
                  auVar96 = vshufps_avx(auVar158,auVar158,0xc9);
                  auVar97 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xc9);
                  auVar159._0_4_ = auVar158._0_4_ * auVar97._0_4_;
                  auVar159._4_4_ = auVar158._4_4_ * auVar97._4_4_;
                  auVar159._8_4_ = auVar158._8_4_ * auVar97._8_4_;
                  auVar159._12_4_ = auVar158._12_4_ * auVar97._12_4_;
                  auVar145 = vfmsub231ps_fma(auVar159,local_a80._0_16_,auVar96);
                  auVar96 = vshufps_avx(auVar145,auVar145,0xc9);
                  auVar97 = vshufps_avx(auVar171,auVar171,0xc9);
                  auVar145 = vshufps_avx(auVar145,auVar145,0xd2);
                  auVar81._0_4_ = auVar171._0_4_ * auVar145._0_4_;
                  auVar81._4_4_ = auVar171._4_4_ * auVar145._4_4_;
                  auVar81._8_4_ = auVar171._8_4_ * auVar145._8_4_;
                  auVar81._12_4_ = auVar171._12_4_ * auVar145._12_4_;
                  auVar96 = vfmsub231ps_fma(auVar81,auVar96,auVar97);
                  uVar63 = auVar96._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar94;
                    uVar2 = vextractps_avx(auVar96,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar96,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar63;
                    *(float *)(ray + k * 4 + 0xf0) = fVar123;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar58;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_710 = vshufps_avx(auVar73,auVar73,0x55);
                    auVar73 = vshufps_avx(auVar96,auVar96,0x55);
                    auStack_730 = vshufps_avx(auVar96,auVar96,0xaa);
                    local_740 = (RTCHitN  [16])auVar73;
                    local_720 = uVar63;
                    uStack_71c = uVar63;
                    uStack_718 = uVar63;
                    uStack_714 = uVar63;
                    local_700 = ZEXT416(0) << 0x20;
                    local_6f0 = CONCAT44(uStack_75c,local_760);
                    uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                    local_6e0._4_4_ = uStack_74c;
                    local_6e0._0_4_ = local_750;
                    local_6e0._8_4_ = uStack_748;
                    local_6e0._12_4_ = uStack_744;
                    vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                    uStack_6cc = context->user->instID[0];
                    local_6d0 = uStack_6cc;
                    uStack_6c8 = uStack_6cc;
                    uStack_6c4 = uStack_6cc;
                    uStack_6c0 = context->user->instPrimID[0];
                    uStack_6bc = uStack_6c0;
                    uStack_6b8 = uStack_6c0;
                    uStack_6b4 = uStack_6c0;
                    *(float *)(ray + k * 4 + 0x80) = fVar94;
                    local_900 = *local_a48;
                    local_af0.valid = (int *)local_900;
                    local_af0.geometryUserPtr = pGVar3->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_740;
                    local_af0.N = 4;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar237 = ZEXT1664(auVar76);
                      (*pGVar3->intersectionFilterN)(&local_af0);
                      auVar258._8_56_ = extraout_var_02;
                      auVar258._0_8_ = extraout_XMM1_Qa_00;
                      auVar79 = auVar258._0_16_;
                      auVar206 = ZEXT3264(local_9e0);
                    }
                    if (local_900 == (undefined1  [16])0x0) {
                      auVar76 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar79 = vpcmpeqd_avx(auVar79,auVar79);
                      auVar76 = auVar76 ^ auVar79;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      auVar79 = vpcmpeqd_avx(auVar73,auVar73);
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar237 = ZEXT1664(auVar237._0_16_);
                        (*p_Var4)(&local_af0);
                        auVar206 = ZEXT3264(local_9e0);
                        auVar79 = vpcmpeqd_avx(auVar79,auVar79);
                      }
                      auVar96 = vpcmpeqd_avx(local_900,_DAT_01f45a50);
                      auVar76 = auVar96 ^ auVar79;
                      if (local_900 != (undefined1  [16])0x0) {
                        auVar96 = auVar96 ^ auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])local_af0.hit);
                        *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x10));
                        *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x20));
                        *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x30));
                        *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x40));
                        *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x50));
                        *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x60));
                        *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x70));
                        *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar79;
                        auVar79 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x80));
                        *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar79;
                      }
                    }
                    auVar242 = ZEXT464((uint)fVar140);
                    auVar258 = ZEXT3264(auVar254);
                    auVar82._8_8_ = 0x100000001;
                    auVar82._0_8_ = 0x100000001;
                    if ((auVar82 & auVar76) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar140;
                    }
                  }
                }
              }
            }
          }
LAB_011948bf:
          uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar231._4_4_ = uVar63;
          auVar231._0_4_ = uVar63;
          auVar231._8_4_ = uVar63;
          auVar231._12_4_ = uVar63;
          auVar231._16_4_ = uVar63;
          auVar231._20_4_ = uVar63;
          auVar231._24_4_ = uVar63;
          auVar231._28_4_ = uVar63;
          auVar232 = ZEXT3264(auVar231);
          auVar84 = vcmpps_avx(_local_820,auVar231,2);
        }
        auVar120._0_4_ = (float)local_8c0._0_4_ + local_4c0._0_4_;
        auVar120._4_4_ = (float)local_8c0._4_4_ + local_4c0._4_4_;
        auVar120._8_4_ = fStack_8b8 + local_4c0._8_4_;
        auVar120._12_4_ = fStack_8b4 + local_4c0._12_4_;
        auVar120._16_4_ = fStack_8b0 + local_4c0._16_4_;
        auVar120._20_4_ = fStack_8ac + local_4c0._20_4_;
        auVar120._24_4_ = fStack_8a8 + local_4c0._24_4_;
        auVar120._28_4_ = fStack_8a4 + local_4c0._28_4_;
        uVar63 = auVar232._0_4_;
        auVar168._4_4_ = uVar63;
        auVar168._0_4_ = uVar63;
        auVar168._8_4_ = uVar63;
        auVar168._12_4_ = uVar63;
        auVar168._16_4_ = uVar63;
        auVar168._20_4_ = uVar63;
        auVar168._24_4_ = uVar63;
        auVar168._28_4_ = uVar63;
        auVar217 = vcmpps_avx(auVar120,auVar168,2);
        auVar84 = vandps_avx(_local_5e0,local_5c0);
        auVar84 = vandps_avx(auVar217,auVar84);
        auVar182._0_4_ = (float)local_8c0._0_4_ + local_480._0_4_;
        auVar182._4_4_ = (float)local_8c0._4_4_ + local_480._4_4_;
        auVar182._8_4_ = fStack_8b8 + local_480._8_4_;
        auVar182._12_4_ = fStack_8b4 + local_480._12_4_;
        auVar182._16_4_ = fStack_8b0 + local_480._16_4_;
        auVar182._20_4_ = fStack_8ac + local_480._20_4_;
        auVar182._24_4_ = fStack_8a8 + local_480._24_4_;
        auVar182._28_4_ = fStack_8a4 + local_480._28_4_;
        auVar178 = vcmpps_avx(auVar182,auVar168,2);
        auVar217 = vandps_avx(_local_860,local_840);
        auVar217 = vandps_avx(auVar178,auVar217);
        auVar217 = vorps_avx(auVar84,auVar217);
        fVar129 = (float)local_8c0._0_4_;
        fVar140 = (float)local_8c0._4_4_;
        fVar141 = fStack_8b8;
        fVar142 = fStack_8b4;
        fVar143 = fStack_8b0;
        fVar208 = fStack_8ac;
        fVar209 = fStack_8a8;
        fVar210 = fStack_8a4;
        if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar217 >> 0x7f,0) != '\0') ||
              (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar217 >> 0xbf,0) != '\0') ||
            (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar217[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar61 * 0x60) = auVar217;
          auVar84 = vblendvps_avx(_local_480,local_4c0,auVar84);
          *(undefined1 (*) [32])(auStack_160 + uVar61 * 0x60) = auVar84;
          uVar62 = vmovlps_avx(local_590);
          (&uStack_140)[uVar61 * 0xc] = uVar62;
          aiStack_138[uVar61 * 0x18] = local_c44 + 1;
          uVar61 = (ulong)((int)uVar61 + 1);
        }
      }
      auVar245 = ZEXT3264(CONCAT824(uStack_948,CONCAT816(uStack_950,CONCAT88(uStack_958,local_960)))
                         );
    }
    while( true ) {
      auVar217 = local_540;
      auVar178 = local_560;
      uVar57 = (uint)uVar61;
      if (uVar57 == 0) {
        uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar83._4_4_ = uVar63;
        auVar83._0_4_ = uVar63;
        auVar83._8_4_ = uVar63;
        auVar83._12_4_ = uVar63;
        auVar5 = vcmpps_avx(local_5a0,auVar83,2);
        uVar58 = vmovmskps_avx(auVar5);
        uVar64 = (ulong)((uint)uVar64 & uVar58);
        goto LAB_0119248e;
      }
      uVar61 = (ulong)(uVar57 - 1);
      lVar59 = uVar61 * 0x60;
      auVar84 = *(undefined1 (*) [32])(auStack_160 + lVar59);
      auVar85._0_4_ = fVar129 + auVar84._0_4_;
      auVar85._4_4_ = fVar140 + auVar84._4_4_;
      auVar85._8_4_ = fVar141 + auVar84._8_4_;
      auVar85._12_4_ = fVar142 + auVar84._12_4_;
      auVar85._16_4_ = fVar143 + auVar84._16_4_;
      auVar85._20_4_ = fVar208 + auVar84._20_4_;
      auVar85._24_4_ = fVar209 + auVar84._24_4_;
      auVar85._28_4_ = fVar210 + auVar84._28_4_;
      uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar163._4_4_ = uVar63;
      auVar163._0_4_ = uVar63;
      auVar163._8_4_ = uVar63;
      auVar163._12_4_ = uVar63;
      auVar163._16_4_ = uVar63;
      auVar163._20_4_ = uVar63;
      auVar163._24_4_ = uVar63;
      auVar163._28_4_ = uVar63;
      auVar203 = vcmpps_avx(auVar85,auVar163,2);
      auVar164 = vandps_avx(auVar203,*(undefined1 (*) [32])(auStack_180 + lVar59));
      _local_740 = auVar164;
      auVar203 = *(undefined1 (*) [32])(auStack_180 + lVar59) & auVar203;
      if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar203 >> 0x7f,0) != '\0') ||
            (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar203 >> 0xbf,0) != '\0') ||
          (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar203[0x1f] < '\0') break;
      uVar61 = (ulong)(uVar57 - 1);
    }
    auVar135._8_4_ = 0x7f800000;
    auVar135._0_8_ = 0x7f8000007f800000;
    auVar135._12_4_ = 0x7f800000;
    auVar135._16_4_ = 0x7f800000;
    auVar135._20_4_ = 0x7f800000;
    auVar135._24_4_ = 0x7f800000;
    auVar135._28_4_ = 0x7f800000;
    auVar84 = vblendvps_avx(auVar135,auVar84,auVar164);
    auVar203 = vshufps_avx(auVar84,auVar84,0xb1);
    auVar203 = vminps_avx(auVar84,auVar203);
    auVar167 = vshufpd_avx(auVar203,auVar203,5);
    auVar203 = vminps_avx(auVar203,auVar167);
    auVar167 = vpermpd_avx2(auVar203,0x4e);
    auVar203 = vminps_avx(auVar203,auVar167);
    auVar84 = vcmpps_avx(auVar84,auVar203,0);
    auVar203 = auVar206._0_32_;
    auVar167 = auVar164 & auVar84;
    if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar167 >> 0x7f,0) != '\0') ||
          (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar167 >> 0xbf,0) != '\0') ||
        (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar167[0x1f] < '\0') {
      auVar164 = vandps_avx(auVar84,auVar164);
    }
    uVar60 = vmovmskps_avx(auVar164);
    iVar12 = 0;
    for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
      iVar12 = iVar12 + 1;
    }
    *(undefined4 *)(local_740 + (uint)(iVar12 << 2)) = 0;
    uVar62 = (&uStack_140)[uVar61 * 0xc];
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar62;
    local_c44 = aiStack_138[uVar61 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar59) = _local_740;
    uVar60 = uVar57 - 1;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar60 = uVar57;
    }
    uVar63 = (undefined4)uVar62;
    auVar114._4_4_ = uVar63;
    auVar114._0_4_ = uVar63;
    auVar114._8_4_ = uVar63;
    auVar114._12_4_ = uVar63;
    auVar114._16_4_ = uVar63;
    auVar114._20_4_ = uVar63;
    auVar114._24_4_ = uVar63;
    auVar114._28_4_ = uVar63;
    auVar76 = vmovshdup_avx(auVar71);
    auVar76 = vsubps_avx(auVar76,auVar71);
    auVar86._0_4_ = auVar76._0_4_;
    auVar86._4_4_ = auVar86._0_4_;
    auVar86._8_4_ = auVar86._0_4_;
    auVar86._12_4_ = auVar86._0_4_;
    auVar86._16_4_ = auVar86._0_4_;
    auVar86._20_4_ = auVar86._0_4_;
    auVar86._24_4_ = auVar86._0_4_;
    auVar86._28_4_ = auVar86._0_4_;
    auVar76 = vfmadd132ps_fma(auVar86,auVar114,_DAT_01f7b040);
    local_4c0 = ZEXT1632(auVar76);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar12 << 2));
    uVar61 = (ulong)uVar60;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }